

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O2

void capnp::_::anon_unknown_133::dynamicCheckTestMessage<capnp::DynamicStruct::Builder>
               (Builder reader)

{
  double dVar1;
  bool result;
  BuilderFor<bool> BVar2;
  int8_t iVar3;
  uint8_t uVar4;
  bool bVar5;
  int16_t iVar6;
  uint16_t uVar7;
  int32_t iVar8;
  uint32_t uVar9;
  uchar *puVar10;
  size_type sVar11;
  float fVar12;
  BuilderFor<DynamicEnum> BVar13;
  DynamicEnum e;
  DynamicEnum e_00;
  DynamicEnum e_01;
  DynamicEnum e_02;
  StringPtr name;
  StringPtr name_00;
  StringPtr name_01;
  StringPtr name_02;
  StringPtr name_03;
  StringPtr name_04;
  StringPtr name_05;
  StringPtr name_06;
  StringPtr name_07;
  StringPtr name_08;
  StringPtr name_09;
  StringPtr name_10;
  StringPtr name_11;
  StringPtr name_12;
  StringPtr name_13;
  StringPtr name_14;
  StringPtr name_15;
  StringPtr name_16;
  StringPtr name_17;
  StringPtr name_18;
  StringPtr name_19;
  StringPtr name_20;
  StringPtr name_21;
  StringPtr name_22;
  StringPtr name_23;
  StringPtr name_24;
  StringPtr name_25;
  StringPtr name_26;
  StringPtr name_27;
  StringPtr name_28;
  StringPtr name_29;
  StringPtr name_30;
  StringPtr name_31;
  StringPtr name_32;
  StringPtr name_33;
  StringPtr name_34;
  StringPtr name_35;
  StringPtr name_36;
  StringPtr name_37;
  StringPtr name_38;
  StringPtr name_39;
  StringPtr name_40;
  StringPtr name_41;
  StringPtr name_42;
  StringPtr name_43;
  StringPtr name_44;
  StringPtr name_45;
  StringPtr name_46;
  StringPtr name_47;
  StringPtr name_48;
  StringPtr name_49;
  StringPtr name_50;
  StringPtr name_51;
  StringPtr name_52;
  StringPtr name_53;
  StringPtr name_54;
  StringPtr name_55;
  StringPtr name_56;
  StringPtr name_57;
  StringPtr name_58;
  StringPtr name_59;
  StringPtr name_60;
  StringPtr name_61;
  StringPtr name_62;
  StringPtr name_63;
  StringPtr name_64;
  StringPtr name_65;
  initializer_list<capnp::Void> expected;
  StringPtr name_66;
  initializer_list<bool> expected_00;
  StringPtr name_67;
  initializer_list<signed_char> expected_01;
  StringPtr name_68;
  initializer_list<short> expected_02;
  StringPtr name_69;
  initializer_list<int> expected_03;
  StringPtr name_70;
  initializer_list<long> expected_04;
  StringPtr name_71;
  initializer_list<unsigned_char> expected_05;
  StringPtr name_72;
  initializer_list<unsigned_short> expected_06;
  StringPtr name_73;
  initializer_list<unsigned_int> expected_07;
  StringPtr name_74;
  initializer_list<unsigned_long> expected_08;
  StringPtr name_75;
  initializer_list<float> expected_09;
  StringPtr name_76;
  initializer_list<double> expected_10;
  StringPtr name_77;
  initializer_list<capnp::Text::Reader> expected_11;
  StringPtr name_78;
  initializer_list<capnp::Data::Reader> expected_12;
  StringPtr name_79;
  StringPtr name_80;
  StringPtr name_81;
  StringPtr name_82;
  StringPtr name_83;
  StringPtr name_84;
  StringPtr name_85;
  StringPtr name_86;
  initializer_list<const_char_*> expected_13;
  StringPtr name_87;
  StringPtr name_88;
  StringPtr name_89;
  StringPtr name_90;
  StringPtr name_91;
  initializer_list<bool> expected_14;
  StringPtr name_92;
  initializer_list<signed_char> expected_15;
  StringPtr name_93;
  initializer_list<short> expected_16;
  StringPtr name_94;
  initializer_list<int> expected_17;
  StringPtr name_95;
  initializer_list<long> expected_18;
  StringPtr name_96;
  initializer_list<unsigned_char> expected_19;
  StringPtr name_97;
  initializer_list<unsigned_short> expected_20;
  StringPtr name_98;
  initializer_list<unsigned_int> expected_21;
  StringPtr name_99;
  initializer_list<unsigned_long> expected_22;
  StringPtr name_x00100;
  StringPtr name_x00101;
  StringPtr name_x00102;
  initializer_list<capnp::Text::Reader> expected_23;
  StringPtr name_x00103;
  initializer_list<capnp::Data::Reader> expected_24;
  StringPtr name_x00104;
  StringPtr name_x00105;
  StringPtr name_x00106;
  StringPtr name_x00107;
  StringPtr name_x00108;
  StringPtr name_x00109;
  StringPtr name_x00110;
  StringPtr name_x00111;
  initializer_list<const_char_*> expected_25;
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_31;
  DebugComparison<const_capnp::Void_&,_capnp::Void> _kjCondition;
  undefined1 local_7f8;
  undefined1 local_7f0;
  DebugComparison<const_char_(&)[14],_capnp::Text::Builder> _kjCondition_29;
  BuilderFor<capnp::DynamicStruct> subReader;
  DebugExpression<bool> _kjCondition_10;
  undefined1 auStack_777 [15];
  bool local_748;
  char *local_740;
  BuilderFor<Text> local_738;
  BuilderFor<DynamicStruct> local_720;
  Builder local_6f0;
  Builder local_6b0;
  Builder local_670;
  Builder local_630;
  Builder local_5f0;
  Builder local_5b0;
  Builder local_570;
  Builder local_530;
  Builder local_4f0;
  Builder local_4b0;
  Builder local_470;
  Builder local_430;
  Builder local_3f0;
  Builder local_3b0;
  Builder local_370;
  Builder local_330;
  Builder local_2f0;
  Builder local_2b0;
  Builder local_270;
  Builder local_230;
  Builder local_1f0;
  Builder local_1b0;
  Builder local_170;
  Builder local_130;
  Builder local_f0;
  Builder local_b0;
  Builder local_70;
  
  name.content.size_ = 10;
  name.content.ptr = "voidField";
  DynamicStruct::Builder::get((Builder *)&_kjCondition_31,&reader,name);
  DynamicValue::Builder::AsImpl<capnp::Void,_(capnp::Kind)0>::apply((Builder *)&_kjCondition_31);
  _kjCondition.left = (Void *)&VOID;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = true;
  DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
  if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
    name_00.content.size_ = 10;
    name_00.content.ptr = "voidField";
    DynamicStruct::Builder::get((Builder *)&_kjCondition_31,&reader,name_00);
    DynamicValue::Builder::AsImpl<capnp::Void,_(capnp::Kind)0>::apply((Builder *)&_kjCondition_31);
    kj::_::Debug::
    log<char_const(&)[73],kj::_::DebugComparison<capnp::Void_const&,capnp::Void>&,capnp::Void_const&,capnp::Void>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x158,ERROR,
               "\"failed: expected \" \"(VOID) == (reader.get(\\\"voidField\\\").template as<Void>())\", _kjCondition, VOID, reader.get(\"voidField\").template as<Void>()"
               ,(char (*) [73])
                "failed: expected (VOID) == (reader.get(\"voidField\").template as<Void>())",
               &_kjCondition,(Void *)&VOID,(Void *)&_kjCondition_29);
    DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
  }
  name_01.content.size_ = 10;
  name_01.content.ptr = "boolField";
  DynamicStruct::Builder::get((Builder *)&_kjCondition_31,&reader,name_01);
  BVar2 = DynamicValue::Builder::AsImpl<bool,_(capnp::Kind)0>::apply((Builder *)&_kjCondition_31);
  _kjCondition.left._0_2_ = CONCAT11(BVar2,1);
  _kjCondition._8_8_ = anon_var_dwarf_b08b;
  _kjCondition.op.content.ptr = &DAT_00000005;
  _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,BVar2);
  DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
  if (((char)_kjCondition.op.content.size_ == '\0') && (kj::_::Debug::minSeverity < 3)) {
    _kjCondition_29.left._0_1_ = 1;
    name_02.content.size_ = 10;
    name_02.content.ptr = "boolField";
    DynamicStruct::Builder::get((Builder *)&_kjCondition_31,&reader,name_02);
    _kjCondition_10.value =
         DynamicValue::Builder::AsImpl<bool,_(capnp::Kind)0>::apply((Builder *)&_kjCondition_31);
    kj::_::Debug::log<char_const(&)[73],kj::_::DebugComparison<bool,bool>&,bool,bool>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x159,ERROR,
               "\"failed: expected \" \"(true) == (reader.get(\\\"boolField\\\").template as<bool>())\", _kjCondition, true, reader.get(\"boolField\").template as<bool>()"
               ,(char (*) [73])
                "failed: expected (true) == (reader.get(\"boolField\").template as<bool>())",
               (DebugComparison<bool,_bool> *)&_kjCondition,(bool *)&_kjCondition_29,
               &_kjCondition_10.value);
    DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
  }
  name_03.content.size_ = 10;
  name_03.content.ptr = "int8Field";
  DynamicStruct::Builder::get((Builder *)&_kjCondition_31,&reader,name_03);
  iVar3 = DynamicValue::Builder::AsImpl<signed_char,_(capnp::Kind)0>::apply
                    ((Builder *)&_kjCondition_31);
  _kjCondition.left._0_5_ = CONCAT14(iVar3,0xffffff85);
  _kjCondition._8_8_ = anon_var_dwarf_b08b;
  _kjCondition.op.content.ptr = &DAT_00000005;
  _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,iVar3 == -0x7b);
  DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
  if (((char)_kjCondition.op.content.size_ == '\0') && (kj::_::Debug::minSeverity < 3)) {
    _kjCondition_29.left._0_4_ = 0xffffff85;
    name_04.content.size_ = 10;
    name_04.content.ptr = "int8Field";
    DynamicStruct::Builder::get((Builder *)&_kjCondition_31,&reader,name_04);
    iVar3 = DynamicValue::Builder::AsImpl<signed_char,_(capnp::Kind)0>::apply
                      ((Builder *)&_kjCondition_31);
    _kjCondition_10.value = (bool)iVar3;
    kj::_::Debug::log<char_const(&)[75],kj::_::DebugComparison<int,signed_char>&,int,signed_char>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x15a,ERROR,
               "\"failed: expected \" \"(-123) == (reader.get(\\\"int8Field\\\").template as<int8_t>())\", _kjCondition, -123, reader.get(\"int8Field\").template as<int8_t>()"
               ,(char (*) [75])
                "failed: expected (-123) == (reader.get(\"int8Field\").template as<int8_t>())",
               (DebugComparison<int,_signed_char> *)&_kjCondition,(int *)&_kjCondition_29,
               &_kjCondition_10.value);
    DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
  }
  name_05.content.size_ = 0xb;
  name_05.content.ptr = "int16Field";
  DynamicStruct::Builder::get((Builder *)&_kjCondition_31,&reader,name_05);
  iVar6 = DynamicValue::Builder::AsImpl<short,_(capnp::Kind)0>::apply((Builder *)&_kjCondition_31);
  _kjCondition.left._0_6_ = CONCAT24(iVar6,0xffffcfc7);
  _kjCondition._8_8_ = anon_var_dwarf_b08b;
  _kjCondition.op.content.ptr = &DAT_00000005;
  _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,iVar6 == -0x3039);
  DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
  if (((char)_kjCondition.op.content.size_ == '\0') && (kj::_::Debug::minSeverity < 3)) {
    _kjCondition_29.left._0_4_ = 0xffffcfc7;
    name_06.content.size_ = 0xb;
    name_06.content.ptr = "int16Field";
    DynamicStruct::Builder::get((Builder *)&_kjCondition_31,&reader,name_06);
    iVar6 = DynamicValue::Builder::AsImpl<short,_(capnp::Kind)0>::apply((Builder *)&_kjCondition_31)
    ;
    __kjCondition_10 = iVar6;
    kj::_::Debug::log<char_const(&)[79],kj::_::DebugComparison<int,short>&,int,short>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x15b,ERROR,
               "\"failed: expected \" \"(-12345) == (reader.get(\\\"int16Field\\\").template as<int16_t>())\", _kjCondition, -12345, reader.get(\"int16Field\").template as<int16_t>()"
               ,(char (*) [79])
                "failed: expected (-12345) == (reader.get(\"int16Field\").template as<int16_t>())",
               (DebugComparison<int,_short> *)&_kjCondition,(int *)&_kjCondition_29,
               (short *)&_kjCondition_10);
    DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
  }
  name_07.content.size_ = 0xb;
  name_07.content.ptr = "int32Field";
  DynamicStruct::Builder::get((Builder *)&_kjCondition_31,&reader,name_07);
  iVar8 = DynamicValue::Builder::AsImpl<int,_(capnp::Kind)0>::apply((Builder *)&_kjCondition_31);
  _kjCondition.left = (Void *)CONCAT44(iVar8,0xff439eb2);
  _kjCondition._8_8_ = anon_var_dwarf_b08b;
  _kjCondition.op.content.ptr = &DAT_00000005;
  _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,iVar8 == -0xbc614e);
  DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
  if (((char)_kjCondition.op.content.size_ == '\0') && (kj::_::Debug::minSeverity < 3)) {
    _kjCondition_29.left._0_4_ = 0xff439eb2;
    name_08.content.size_ = 0xb;
    name_08.content.ptr = "int32Field";
    DynamicStruct::Builder::get((Builder *)&_kjCondition_31,&reader,name_08);
    iVar8 = DynamicValue::Builder::AsImpl<int,_(capnp::Kind)0>::apply((Builder *)&_kjCondition_31);
    __kjCondition_10 = iVar8;
    kj::_::Debug::log<char_const(&)[82],kj::_::DebugComparison<int,int>&,int,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x15c,ERROR,
               "\"failed: expected \" \"(-12345678) == (reader.get(\\\"int32Field\\\").template as<int32_t>())\", _kjCondition, -12345678, reader.get(\"int32Field\").template as<int32_t>()"
               ,(char (*) [82])
                "failed: expected (-12345678) == (reader.get(\"int32Field\").template as<int32_t>())"
               ,(DebugComparison<int,_int> *)&_kjCondition,(int *)&_kjCondition_29,
               (int *)&_kjCondition_10);
    DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
  }
  name_09.content.size_ = 0xb;
  name_09.content.ptr = "int64Field";
  DynamicStruct::Builder::get((Builder *)&_kjCondition_31,&reader,name_09);
  _kjCondition._8_8_ =
       DynamicValue::Builder::AsImpl<long,_(capnp::Kind)0>::apply((Builder *)&_kjCondition_31);
  _kjCondition.result = _kjCondition._8_8_ == -0x7048860ddf79;
  _kjCondition.left = (Void *)0xffff8fb779f22087;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
  if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
    _kjCondition_29.left = (char (*) [14])0xffff8fb779f22087;
    name_10.content.size_ = 0xb;
    name_10.content.ptr = "int64Field";
    DynamicStruct::Builder::get((Builder *)&_kjCondition_31,&reader,name_10);
    puVar10 = (uchar *)DynamicValue::Builder::AsImpl<long,_(capnp::Kind)0>::apply
                                 ((Builder *)&_kjCondition_31);
    __kjCondition_10 = puVar10;
    kj::_::Debug::log<char_const(&)[91],kj::_::DebugComparison<long_long,long>&,long_long,long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x15d,ERROR,
               "\"failed: expected \" \"(-123456789012345ll) == (reader.get(\\\"int64Field\\\").template as<int64_t>())\", _kjCondition, -123456789012345ll, reader.get(\"int64Field\").template as<int64_t>()"
               ,(char (*) [91])
                "failed: expected (-123456789012345ll) == (reader.get(\"int64Field\").template as<int64_t>())"
               ,(DebugComparison<long_long,_long> *)&_kjCondition,(longlong *)&_kjCondition_29,
               (long *)&_kjCondition_10);
    DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
  }
  name_11.content.size_ = 0xb;
  name_11.content.ptr = "uInt8Field";
  DynamicStruct::Builder::get((Builder *)&_kjCondition_31,&reader,name_11);
  uVar4 = DynamicValue::Builder::AsImpl<unsigned_char,_(capnp::Kind)0>::apply
                    ((Builder *)&_kjCondition_31);
  _kjCondition.left._0_5_ = CONCAT14(uVar4,0xea);
  _kjCondition._8_8_ = anon_var_dwarf_b08b;
  _kjCondition.op.content.ptr = &DAT_00000005;
  _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,uVar4 == 0xea);
  DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
  if (((char)_kjCondition.op.content.size_ == '\0') && (kj::_::Debug::minSeverity < 3)) {
    _kjCondition_29.left._0_4_ = 0xea;
    name_12.content.size_ = 0xb;
    name_12.content.ptr = "uInt8Field";
    DynamicStruct::Builder::get((Builder *)&_kjCondition_31,&reader,name_12);
    uVar4 = DynamicValue::Builder::AsImpl<unsigned_char,_(capnp::Kind)0>::apply
                      ((Builder *)&_kjCondition_31);
    _kjCondition_10.value = (bool)uVar4;
    kj::_::Debug::
    log<char_const(&)[77],kj::_::DebugComparison<unsigned_int,unsigned_char>&,unsigned_int,unsigned_char>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x15e,ERROR,
               "\"failed: expected \" \"(234u) == (reader.get(\\\"uInt8Field\\\").template as<uint8_t>())\", _kjCondition, 234u, reader.get(\"uInt8Field\").template as<uint8_t>()"
               ,(char (*) [77])
                "failed: expected (234u) == (reader.get(\"uInt8Field\").template as<uint8_t>())",
               (DebugComparison<unsigned_int,_unsigned_char> *)&_kjCondition,
               (uint *)&_kjCondition_29,&_kjCondition_10.value);
    DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
  }
  name_13.content.size_ = 0xc;
  name_13.content.ptr = "uInt16Field";
  DynamicStruct::Builder::get((Builder *)&_kjCondition_31,&reader,name_13);
  uVar7 = DynamicValue::Builder::AsImpl<unsigned_short,_(capnp::Kind)0>::apply
                    ((Builder *)&_kjCondition_31);
  _kjCondition.left._0_6_ = CONCAT24(uVar7,0xb26e);
  _kjCondition._8_8_ = anon_var_dwarf_b08b;
  _kjCondition.op.content.ptr = &DAT_00000005;
  _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,uVar7 == 0xb26e);
  DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
  if (((char)_kjCondition.op.content.size_ == '\0') && (kj::_::Debug::minSeverity < 3)) {
    _kjCondition_29.left._0_4_ = 0xb26e;
    name_14.content.size_ = 0xc;
    name_14.content.ptr = "uInt16Field";
    DynamicStruct::Builder::get((Builder *)&_kjCondition_31,&reader,name_14);
    uVar7 = DynamicValue::Builder::AsImpl<unsigned_short,_(capnp::Kind)0>::apply
                      ((Builder *)&_kjCondition_31);
    __kjCondition_10 = uVar7;
    kj::_::Debug::
    log<char_const(&)[81],kj::_::DebugComparison<unsigned_int,unsigned_short>&,unsigned_int,unsigned_short>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x15f,ERROR,
               "\"failed: expected \" \"(45678u) == (reader.get(\\\"uInt16Field\\\").template as<uint16_t>())\", _kjCondition, 45678u, reader.get(\"uInt16Field\").template as<uint16_t>()"
               ,(char (*) [81])
                "failed: expected (45678u) == (reader.get(\"uInt16Field\").template as<uint16_t>())"
               ,(DebugComparison<unsigned_int,_unsigned_short> *)&_kjCondition,
               (uint *)&_kjCondition_29,(unsigned_short *)&_kjCondition_10);
    DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
  }
  name_15.content.size_ = 0xc;
  name_15.content.ptr = "uInt32Field";
  DynamicStruct::Builder::get((Builder *)&_kjCondition_31,&reader,name_15);
  uVar9 = DynamicValue::Builder::AsImpl<unsigned_int,_(capnp::Kind)0>::apply
                    ((Builder *)&_kjCondition_31);
  _kjCondition.left = (Void *)CONCAT44(uVar9,0xce0a6a14);
  _kjCondition._8_8_ = anon_var_dwarf_b08b;
  _kjCondition.op.content.ptr = &DAT_00000005;
  _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,uVar9 == 0xce0a6a14);
  DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
  if (((char)_kjCondition.op.content.size_ == '\0') && (kj::_::Debug::minSeverity < 3)) {
    _kjCondition_29.left._0_4_ = 0xce0a6a14;
    name_16.content.size_ = 0xc;
    name_16.content.ptr = "uInt32Field";
    DynamicStruct::Builder::get((Builder *)&_kjCondition_31,&reader,name_16);
    uVar9 = DynamicValue::Builder::AsImpl<unsigned_int,_(capnp::Kind)0>::apply
                      ((Builder *)&_kjCondition_31);
    __kjCondition_10 = uVar9;
    kj::_::Debug::
    log<char_const(&)[86],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x160,ERROR,
               "\"failed: expected \" \"(3456789012u) == (reader.get(\\\"uInt32Field\\\").template as<uint32_t>())\", _kjCondition, 3456789012u, reader.get(\"uInt32Field\").template as<uint32_t>()"
               ,(char (*) [86])
                "failed: expected (3456789012u) == (reader.get(\"uInt32Field\").template as<uint32_t>())"
               ,(DebugComparison<unsigned_int,_unsigned_int> *)&_kjCondition,
               (uint *)&_kjCondition_29,(uint *)&_kjCondition_10);
    DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
  }
  name_17.content.size_ = 0xc;
  name_17.content.ptr = "uInt64Field";
  DynamicStruct::Builder::get((Builder *)&_kjCondition_31,&reader,name_17);
  _kjCondition._8_8_ =
       DynamicValue::Builder::AsImpl<unsigned_long,_(capnp::Kind)0>::apply
                 ((Builder *)&_kjCondition_31);
  _kjCondition.result = _kjCondition._8_8_ == 0xab54a98ceb1f0ad2;
  _kjCondition.left = (Void *)0xab54a98ceb1f0ad2;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
  if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
    _kjCondition_29.left = (char (*) [14])0xab54a98ceb1f0ad2;
    name_18.content.size_ = 0xc;
    name_18.content.ptr = "uInt64Field";
    DynamicStruct::Builder::get((Builder *)&_kjCondition_31,&reader,name_18);
    puVar10 = (uchar *)DynamicValue::Builder::AsImpl<unsigned_long,_(capnp::Kind)0>::apply
                                 ((Builder *)&_kjCondition_31);
    __kjCondition_10 = puVar10;
    kj::_::Debug::
    log<char_const(&)[98],kj::_::DebugComparison<unsigned_long_long,unsigned_long>&,unsigned_long_long,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x161,ERROR,
               "\"failed: expected \" \"(12345678901234567890ull) == (reader.get(\\\"uInt64Field\\\").template as<uint64_t>())\", _kjCondition, 12345678901234567890ull, reader.get(\"uInt64Field\").template as<uint64_t>()"
               ,(char (*) [98])
                "failed: expected (12345678901234567890ull) == (reader.get(\"uInt64Field\").template as<uint64_t>())"
               ,(DebugComparison<unsigned_long_long,_unsigned_long> *)&_kjCondition,
               (unsigned_long_long *)&_kjCondition_29,(unsigned_long *)&_kjCondition_10);
    DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
  }
  name_19.content.size_ = 0xd;
  name_19.content.ptr = "float32Field";
  DynamicStruct::Builder::get((Builder *)&_kjCondition_31,&reader,name_19);
  fVar12 = DynamicValue::Builder::AsImpl<float,_(capnp::Kind)0>::apply((Builder *)&_kjCondition_31);
  bVar5 = kj::_::floatAlmostEqual(fVar12,1234.5);
  _kjCondition_10.value = bVar5;
  DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
  if ((_kjCondition_10.value == false) && (kj::_::Debug::minSeverity < 3)) {
    name_20.content.size_ = 0xd;
    name_20.content.ptr = "float32Field";
    DynamicStruct::Builder::get((Builder *)&_kjCondition_31,&reader,name_20);
    fVar12 = DynamicValue::Builder::AsImpl<float,_(capnp::Kind)0>::apply
                       ((Builder *)&_kjCondition_31);
    _kjCondition.left = (Void *)CONCAT44(_kjCondition.left._4_4_,fVar12);
    _kjCondition_29.left._0_4_ = 0x449a5000;
    kj::_::Debug::log<char_const(&)[101],kj::_::DebugExpression<bool>&,float,float>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x162,ERROR,
               "\"failed: expected \" \"::kj::_::floatAlmostEqual(reader.get(\\\"float32Field\\\").template as<float>(), 1234.5f)\", _kjCondition, reader.get(\"float32Field\").template as<float>(), 1234.5f"
               ,(char (*) [101])
                "failed: expected ::kj::_::floatAlmostEqual(reader.get(\"float32Field\").template as<float>(), 1234.5f)"
               ,&_kjCondition_10,(float *)&_kjCondition,(float *)&_kjCondition_29);
    DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
  }
  name_21.content.size_ = 0xd;
  name_21.content.ptr = "float64Field";
  DynamicStruct::Builder::get((Builder *)&_kjCondition_31,&reader,name_21);
  dVar1 = DynamicValue::Builder::AsImpl<double,_(capnp::Kind)0>::apply((Builder *)&_kjCondition_31);
  bVar5 = kj::_::doubleAlmostEqual(dVar1,-1.23e+47);
  _kjCondition_10.value = bVar5;
  DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
  if ((_kjCondition_10.value == false) && (kj::_::Debug::minSeverity < 3)) {
    name_22.content.size_ = 0xd;
    name_22.content.ptr = "float64Field";
    DynamicStruct::Builder::get((Builder *)&_kjCondition_31,&reader,name_22);
    _kjCondition.left =
         (Void *)DynamicValue::Builder::AsImpl<double,_(capnp::Kind)0>::apply
                           ((Builder *)&_kjCondition_31);
    _kjCondition_29.left = (char (*) [14])0xc9b58b82c0e0bb00;
    kj::_::Debug::log<char_const(&)[103],kj::_::DebugExpression<bool>&,double,double>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x163,ERROR,
               "\"failed: expected \" \"::kj::_::doubleAlmostEqual(reader.get(\\\"float64Field\\\").template as<double>(), -123e45)\", _kjCondition, reader.get(\"float64Field\").template as<double>(), -123e45"
               ,(char (*) [103])
                "failed: expected ::kj::_::doubleAlmostEqual(reader.get(\"float64Field\").template as<double>(), -123e45)"
               ,&_kjCondition_10,(double *)&_kjCondition,(double *)&_kjCondition_29);
    DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
  }
  __kjCondition_10 = (uchar *)"foo";
  name_23.content.size_ = 10;
  name_23.content.ptr = "textField";
  DynamicStruct::Builder::get((Builder *)&_kjCondition_31,&reader,name_23);
  DynamicValue::Builder::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
            ((BuilderFor<Text> *)&_kjCondition_29,(Builder *)&_kjCondition_31);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_capnp::Text::Builder> *)&_kjCondition,
             (DebugExpression<char_const(&)[4]> *)&_kjCondition_10,(Builder *)&_kjCondition_29);
  DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
  if (((bool)local_7f0 == false) && (kj::_::Debug::minSeverity < 3)) {
    name_24.content.size_ = 10;
    name_24.content.ptr = "textField";
    DynamicStruct::Builder::get((Builder *)&_kjCondition_31,&reader,name_24);
    DynamicValue::Builder::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
              ((BuilderFor<Text> *)&_kjCondition_29,(Builder *)&_kjCondition_31);
    kj::_::Debug::
    log<char_const(&)[74],kj::_::DebugComparison<char_const(&)[4],capnp::Text::Builder>&,char_const(&)[4],capnp::Text::Builder>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x164,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (reader.get(\\\"textField\\\").template as<Text>())\", _kjCondition, \"foo\", reader.get(\"textField\").template as<Text>()"
               ,(char (*) [74])
                "failed: expected (\"foo\") == (reader.get(\"textField\").template as<Text>())",
               (DebugComparison<const_char_(&)[4],_capnp::Text::Builder> *)&_kjCondition,
               (char (*) [4])"foo",(Builder *)&_kjCondition_29);
    DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
  }
  _kjCondition_29._0_16_ = _::data("bar");
  name_25.content.size_ = 10;
  name_25.content.ptr = "dataField";
  DynamicStruct::Builder::get((Builder *)&_kjCondition_31,&reader,name_25);
  __kjCondition_10 =
       (ArrayPtr<unsigned_char>)
       DynamicValue::Builder::AsImpl<capnp::Data,_(capnp::Kind)1>::apply
                 ((Builder *)&_kjCondition_31);
  kj::_::DebugExpression<capnp::Data::Reader>::operator==
            ((DebugComparison<capnp::Data::Reader,_capnp::Data::Builder> *)&_kjCondition,
             (DebugExpression<capnp::Data::Reader> *)&_kjCondition_29,(Builder *)&_kjCondition_10);
  DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
  if (((bool)local_7f0 == false) && (kj::_::Debug::minSeverity < 3)) {
    _kjCondition_29._0_16_ = _::data("bar");
    name_26.content.size_ = 10;
    name_26.content.ptr = "dataField";
    DynamicStruct::Builder::get((Builder *)&_kjCondition_31,&reader,name_26);
    __kjCondition_10 =
         (ArrayPtr<unsigned_char>)
         DynamicValue::Builder::AsImpl<capnp::Data,_(capnp::Kind)1>::apply
                   ((Builder *)&_kjCondition_31);
    kj::_::Debug::
    log<char_const(&)[80],kj::_::DebugComparison<capnp::Data::Reader,capnp::Data::Builder>&,capnp::Data::Reader,capnp::Data::Builder>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x165,ERROR,
               "\"failed: expected \" \"(data(\\\"bar\\\")) == (reader.get(\\\"dataField\\\").template as<Data>())\", _kjCondition, data(\"bar\"), reader.get(\"dataField\").template as<Data>()"
               ,(char (*) [80])
                "failed: expected (data(\"bar\")) == (reader.get(\"dataField\").template as<Data>())"
               ,(DebugComparison<capnp::Data::Reader,_capnp::Data::Builder> *)&_kjCondition,
               (Reader *)&_kjCondition_29,(Builder *)&_kjCondition_10);
    DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
  }
  name_27.content.size_ = 0xc;
  name_27.content.ptr = "structField";
  DynamicStruct::Builder::get((Builder *)&_kjCondition_31,&reader,name_27);
  DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            (&subReader,(Builder *)&_kjCondition_31);
  DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
  name_28.content.size_ = 10;
  name_28.content.ptr = "voidField";
  DynamicStruct::Builder::get((Builder *)&_kjCondition_31,&subReader,name_28);
  DynamicValue::Builder::AsImpl<capnp::Void,_(capnp::Kind)0>::apply((Builder *)&_kjCondition_31);
  _kjCondition.left = (Void *)&VOID;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = true;
  DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
  if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
    name_29.content.size_ = 10;
    name_29.content.ptr = "voidField";
    DynamicStruct::Builder::get((Builder *)&_kjCondition_31,&subReader,name_29);
    DynamicValue::Builder::AsImpl<capnp::Void,_(capnp::Kind)0>::apply((Builder *)&_kjCondition_31);
    kj::_::Debug::
    log<char_const(&)[76],kj::_::DebugComparison<capnp::Void_const&,capnp::Void>&,capnp::Void_const&,capnp::Void>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x168,ERROR,
               "\"failed: expected \" \"(VOID) == (subReader.get(\\\"voidField\\\").template as<Void>())\", _kjCondition, VOID, subReader.get(\"voidField\").template as<Void>()"
               ,(char (*) [76])
                "failed: expected (VOID) == (subReader.get(\"voidField\").template as<Void>())",
               &_kjCondition,(Void *)&VOID,(Void *)&_kjCondition_29);
    DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
  }
  name_30.content.size_ = 10;
  name_30.content.ptr = "boolField";
  DynamicStruct::Builder::get((Builder *)&_kjCondition_31,&subReader,name_30);
  BVar2 = DynamicValue::Builder::AsImpl<bool,_(capnp::Kind)0>::apply((Builder *)&_kjCondition_31);
  _kjCondition.left._0_2_ = CONCAT11(BVar2,1);
  _kjCondition._8_8_ = anon_var_dwarf_b08b;
  _kjCondition.op.content.ptr = &DAT_00000005;
  _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,BVar2);
  DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
  if (((char)_kjCondition.op.content.size_ == '\0') && (kj::_::Debug::minSeverity < 3)) {
    _kjCondition_29.left._0_1_ = 1;
    name_31.content.size_ = 10;
    name_31.content.ptr = "boolField";
    DynamicStruct::Builder::get((Builder *)&_kjCondition_31,&subReader,name_31);
    BVar2 = DynamicValue::Builder::AsImpl<bool,_(capnp::Kind)0>::apply((Builder *)&_kjCondition_31);
    _kjCondition_10.value = BVar2;
    kj::_::Debug::log<char_const(&)[76],kj::_::DebugComparison<bool,bool>&,bool,bool>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x169,ERROR,
               "\"failed: expected \" \"(true) == (subReader.get(\\\"boolField\\\").template as<bool>())\", _kjCondition, true, subReader.get(\"boolField\").template as<bool>()"
               ,(char (*) [76])
                "failed: expected (true) == (subReader.get(\"boolField\").template as<bool>())",
               (DebugComparison<bool,_bool> *)&_kjCondition,(bool *)&_kjCondition_29,
               (bool *)&_kjCondition_10);
    DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
  }
  name_32.content.size_ = 10;
  name_32.content.ptr = "int8Field";
  DynamicStruct::Builder::get((Builder *)&_kjCondition_31,&subReader,name_32);
  iVar3 = DynamicValue::Builder::AsImpl<signed_char,_(capnp::Kind)0>::apply
                    ((Builder *)&_kjCondition_31);
  _kjCondition.left._0_5_ = CONCAT14(iVar3,0xfffffff4);
  _kjCondition._8_8_ = anon_var_dwarf_b08b;
  _kjCondition.op.content.ptr = &DAT_00000005;
  _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,iVar3 == -0xc);
  DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
  if (((char)_kjCondition.op.content.size_ == '\0') && (kj::_::Debug::minSeverity < 3)) {
    _kjCondition_29.left._0_4_ = 0xfffffff4;
    name_33.content.size_ = 10;
    name_33.content.ptr = "int8Field";
    DynamicStruct::Builder::get((Builder *)&_kjCondition_31,&subReader,name_33);
    iVar3 = DynamicValue::Builder::AsImpl<signed_char,_(capnp::Kind)0>::apply
                      ((Builder *)&_kjCondition_31);
    _kjCondition_10.value = (bool)iVar3;
    kj::_::Debug::log<char_const(&)[77],kj::_::DebugComparison<int,signed_char>&,int,signed_char>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x16a,ERROR,
               "\"failed: expected \" \"(-12) == (subReader.get(\\\"int8Field\\\").template as<int8_t>())\", _kjCondition, -12, subReader.get(\"int8Field\").template as<int8_t>()"
               ,(char (*) [77])
                "failed: expected (-12) == (subReader.get(\"int8Field\").template as<int8_t>())",
               (DebugComparison<int,_signed_char> *)&_kjCondition,(int *)&_kjCondition_29,
               (char *)&_kjCondition_10);
    DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
  }
  name_34.content.size_ = 0xb;
  name_34.content.ptr = "int16Field";
  DynamicStruct::Builder::get((Builder *)&_kjCondition_31,&subReader,name_34);
  iVar6 = DynamicValue::Builder::AsImpl<short,_(capnp::Kind)0>::apply((Builder *)&_kjCondition_31);
  _kjCondition.left._0_6_ = CONCAT24(iVar6,0xd80);
  _kjCondition._8_8_ = anon_var_dwarf_b08b;
  _kjCondition.op.content.ptr = &DAT_00000005;
  _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,iVar6 == 0xd80);
  DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
  if (((char)_kjCondition.op.content.size_ == '\0') && (kj::_::Debug::minSeverity < 3)) {
    _kjCondition_29.left._0_4_ = 0xd80;
    name_35.content.size_ = 0xb;
    name_35.content.ptr = "int16Field";
    DynamicStruct::Builder::get((Builder *)&_kjCondition_31,&subReader,name_35);
    iVar6 = DynamicValue::Builder::AsImpl<short,_(capnp::Kind)0>::apply((Builder *)&_kjCondition_31)
    ;
    __kjCondition_10 = iVar6;
    kj::_::Debug::log<char_const(&)[80],kj::_::DebugComparison<int,short>&,int,short>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x16b,ERROR,
               "\"failed: expected \" \"(3456) == (subReader.get(\\\"int16Field\\\").template as<int16_t>())\", _kjCondition, 3456, subReader.get(\"int16Field\").template as<int16_t>()"
               ,(char (*) [80])
                "failed: expected (3456) == (subReader.get(\"int16Field\").template as<int16_t>())",
               (DebugComparison<int,_short> *)&_kjCondition,(int *)&_kjCondition_29,
               (short *)&_kjCondition_10);
    DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
  }
  name_36.content.size_ = 0xb;
  name_36.content.ptr = "int32Field";
  DynamicStruct::Builder::get((Builder *)&_kjCondition_31,&subReader,name_36);
  iVar8 = DynamicValue::Builder::AsImpl<int,_(capnp::Kind)0>::apply((Builder *)&_kjCondition_31);
  _kjCondition.left = (Void *)CONCAT44(iVar8,0xfb4c100e);
  _kjCondition._8_8_ = anon_var_dwarf_b08b;
  _kjCondition.op.content.ptr = &DAT_00000005;
  _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,iVar8 == -0x4b3eff2);
  DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
  if (((char)_kjCondition.op.content.size_ == '\0') && (kj::_::Debug::minSeverity < 3)) {
    _kjCondition_29.left._0_4_ = 0xfb4c100e;
    name_37.content.size_ = 0xb;
    name_37.content.ptr = "int32Field";
    DynamicStruct::Builder::get((Builder *)&_kjCondition_31,&subReader,name_37);
    iVar8 = DynamicValue::Builder::AsImpl<int,_(capnp::Kind)0>::apply((Builder *)&_kjCondition_31);
    __kjCondition_10 = iVar8;
    kj::_::Debug::log<char_const(&)[85],kj::_::DebugComparison<int,int>&,int,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x16c,ERROR,
               "\"failed: expected \" \"(-78901234) == (subReader.get(\\\"int32Field\\\").template as<int32_t>())\", _kjCondition, -78901234, subReader.get(\"int32Field\").template as<int32_t>()"
               ,(char (*) [85])
                "failed: expected (-78901234) == (subReader.get(\"int32Field\").template as<int32_t>())"
               ,(DebugComparison<int,_int> *)&_kjCondition,(int *)&_kjCondition_29,
               (int *)&_kjCondition_10);
    DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
  }
  name_38.content.size_ = 0xb;
  name_38.content.ptr = "int64Field";
  DynamicStruct::Builder::get((Builder *)&_kjCondition_31,&subReader,name_38);
  _kjCondition._8_8_ =
       DynamicValue::Builder::AsImpl<long,_(capnp::Kind)0>::apply((Builder *)&_kjCondition_31);
  _kjCondition.result = _kjCondition._8_8_ == 0x33a638e8734e;
  _kjCondition.left = (Void *)0x33a638e8734e;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
  if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
    _kjCondition_29.left = (char (*) [14])0x33a638e8734e;
    name_39.content.size_ = 0xb;
    name_39.content.ptr = "int64Field";
    DynamicStruct::Builder::get((Builder *)&_kjCondition_31,&subReader,name_39);
    puVar10 = (uchar *)DynamicValue::Builder::AsImpl<long,_(capnp::Kind)0>::apply
                                 ((Builder *)&_kjCondition_31);
    __kjCondition_10 = puVar10;
    kj::_::Debug::log<char_const(&)[92],kj::_::DebugComparison<long_long,long>&,long_long,long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x16d,ERROR,
               "\"failed: expected \" \"(56789012345678ll) == (subReader.get(\\\"int64Field\\\").template as<int64_t>())\", _kjCondition, 56789012345678ll, subReader.get(\"int64Field\").template as<int64_t>()"
               ,(char (*) [92])
                "failed: expected (56789012345678ll) == (subReader.get(\"int64Field\").template as<int64_t>())"
               ,(DebugComparison<long_long,_long> *)&_kjCondition,(longlong *)&_kjCondition_29,
               (long *)&_kjCondition_10);
    DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
  }
  name_40.content.size_ = 0xb;
  name_40.content.ptr = "uInt8Field";
  DynamicStruct::Builder::get((Builder *)&_kjCondition_31,&subReader,name_40);
  uVar4 = DynamicValue::Builder::AsImpl<unsigned_char,_(capnp::Kind)0>::apply
                    ((Builder *)&_kjCondition_31);
  _kjCondition.left._0_5_ = CONCAT14(uVar4,0x5a);
  _kjCondition._8_8_ = anon_var_dwarf_b08b;
  _kjCondition.op.content.ptr = &DAT_00000005;
  _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,uVar4 == 'Z');
  DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
  if (((char)_kjCondition.op.content.size_ == '\0') && (kj::_::Debug::minSeverity < 3)) {
    _kjCondition_29.left._0_4_ = 0x5a;
    name_41.content.size_ = 0xb;
    name_41.content.ptr = "uInt8Field";
    DynamicStruct::Builder::get((Builder *)&_kjCondition_31,&subReader,name_41);
    uVar4 = DynamicValue::Builder::AsImpl<unsigned_char,_(capnp::Kind)0>::apply
                      ((Builder *)&_kjCondition_31);
    _kjCondition_10.value = (bool)uVar4;
    kj::_::Debug::
    log<char_const(&)[79],kj::_::DebugComparison<unsigned_int,unsigned_char>&,unsigned_int,unsigned_char>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x16e,ERROR,
               "\"failed: expected \" \"(90u) == (subReader.get(\\\"uInt8Field\\\").template as<uint8_t>())\", _kjCondition, 90u, subReader.get(\"uInt8Field\").template as<uint8_t>()"
               ,(char (*) [79])
                "failed: expected (90u) == (subReader.get(\"uInt8Field\").template as<uint8_t>())",
               (DebugComparison<unsigned_int,_unsigned_char> *)&_kjCondition,
               (uint *)&_kjCondition_29,(uchar *)&_kjCondition_10);
    DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
  }
  name_42.content.size_ = 0xc;
  name_42.content.ptr = "uInt16Field";
  DynamicStruct::Builder::get((Builder *)&_kjCondition_31,&subReader,name_42);
  uVar7 = DynamicValue::Builder::AsImpl<unsigned_short,_(capnp::Kind)0>::apply
                    ((Builder *)&_kjCondition_31);
  _kjCondition.left._0_6_ = CONCAT24(uVar7,0x4d2);
  _kjCondition._8_8_ = anon_var_dwarf_b08b;
  _kjCondition.op.content.ptr = &DAT_00000005;
  _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,uVar7 == 0x4d2);
  DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
  if (((char)_kjCondition.op.content.size_ == '\0') && (kj::_::Debug::minSeverity < 3)) {
    _kjCondition_29.left._0_4_ = 0x4d2;
    name_43.content.size_ = 0xc;
    name_43.content.ptr = "uInt16Field";
    DynamicStruct::Builder::get((Builder *)&_kjCondition_31,&subReader,name_43);
    uVar7 = DynamicValue::Builder::AsImpl<unsigned_short,_(capnp::Kind)0>::apply
                      ((Builder *)&_kjCondition_31);
    __kjCondition_10 = uVar7;
    kj::_::Debug::
    log<char_const(&)[83],kj::_::DebugComparison<unsigned_int,unsigned_short>&,unsigned_int,unsigned_short>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x16f,ERROR,
               "\"failed: expected \" \"(1234u) == (subReader.get(\\\"uInt16Field\\\").template as<uint16_t>())\", _kjCondition, 1234u, subReader.get(\"uInt16Field\").template as<uint16_t>()"
               ,(char (*) [83])
                "failed: expected (1234u) == (subReader.get(\"uInt16Field\").template as<uint16_t>())"
               ,(DebugComparison<unsigned_int,_unsigned_short> *)&_kjCondition,
               (uint *)&_kjCondition_29,(unsigned_short *)&_kjCondition_10);
    DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
  }
  name_44.content.size_ = 0xc;
  name_44.content.ptr = "uInt32Field";
  DynamicStruct::Builder::get((Builder *)&_kjCondition_31,&subReader,name_44);
  uVar9 = DynamicValue::Builder::AsImpl<unsigned_int,_(capnp::Kind)0>::apply
                    ((Builder *)&_kjCondition_31);
  _kjCondition.left = (Void *)CONCAT44(uVar9,0x3628814);
  _kjCondition._8_8_ = anon_var_dwarf_b08b;
  _kjCondition.op.content.ptr = &DAT_00000005;
  _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,uVar9 == 0x3628814);
  DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
  if (((char)_kjCondition.op.content.size_ == '\0') && (kj::_::Debug::minSeverity < 3)) {
    _kjCondition_29.left._0_4_ = 0x3628814;
    name_45.content.size_ = 0xc;
    name_45.content.ptr = "uInt32Field";
    DynamicStruct::Builder::get((Builder *)&_kjCondition_31,&subReader,name_45);
    uVar9 = DynamicValue::Builder::AsImpl<unsigned_int,_(capnp::Kind)0>::apply
                      ((Builder *)&_kjCondition_31);
    __kjCondition_10 = uVar9;
    kj::_::Debug::
    log<char_const(&)[87],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x170,ERROR,
               "\"failed: expected \" \"(56789012u) == (subReader.get(\\\"uInt32Field\\\").template as<uint32_t>())\", _kjCondition, 56789012u, subReader.get(\"uInt32Field\").template as<uint32_t>()"
               ,(char (*) [87])
                "failed: expected (56789012u) == (subReader.get(\"uInt32Field\").template as<uint32_t>())"
               ,(DebugComparison<unsigned_int,_unsigned_int> *)&_kjCondition,
               (uint *)&_kjCondition_29,(uint *)&_kjCondition_10);
    DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
  }
  name_46.content.size_ = 0xc;
  name_46.content.ptr = "uInt64Field";
  DynamicStruct::Builder::get((Builder *)&_kjCondition_31,&subReader,name_46);
  _kjCondition._8_8_ =
       DynamicValue::Builder::AsImpl<unsigned_long,_(capnp::Kind)0>::apply
                 ((Builder *)&_kjCondition_31);
  _kjCondition.result = _kjCondition._8_8_ == 0x4cc1921126f0ad2;
  _kjCondition.left = (Void *)0x4cc1921126f0ad2;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
  if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
    _kjCondition_29.left = (char (*) [14])0x4cc1921126f0ad2;
    name_47.content.size_ = 0xc;
    name_47.content.ptr = "uInt64Field";
    DynamicStruct::Builder::get((Builder *)&_kjCondition_31,&subReader,name_47);
    puVar10 = (uchar *)DynamicValue::Builder::AsImpl<unsigned_long,_(capnp::Kind)0>::apply
                                 ((Builder *)&_kjCondition_31);
    __kjCondition_10 = puVar10;
    kj::_::Debug::
    log<char_const(&)[99],kj::_::DebugComparison<unsigned_long_long,unsigned_long>&,unsigned_long_long,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x171,ERROR,
               "\"failed: expected \" \"(345678901234567890ull) == (subReader.get(\\\"uInt64Field\\\").template as<uint64_t>())\", _kjCondition, 345678901234567890ull, subReader.get(\"uInt64Field\").template as<uint64_t>()"
               ,(char (*) [99])
                "failed: expected (345678901234567890ull) == (subReader.get(\"uInt64Field\").template as<uint64_t>())"
               ,(DebugComparison<unsigned_long_long,_unsigned_long> *)&_kjCondition,
               (unsigned_long_long *)&_kjCondition_29,(unsigned_long *)&_kjCondition_10);
    DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
  }
  name_48.content.size_ = 0xd;
  name_48.content.ptr = "float32Field";
  DynamicStruct::Builder::get((Builder *)&_kjCondition_31,&subReader,name_48);
  fVar12 = DynamicValue::Builder::AsImpl<float,_(capnp::Kind)0>::apply((Builder *)&_kjCondition_31);
  bVar5 = kj::_::floatAlmostEqual(fVar12,-1.25e-10);
  _kjCondition_10.value = bVar5;
  DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
  if ((_kjCondition_10.value == false) && (kj::_::Debug::minSeverity < 3)) {
    name_49.content.size_ = 0xd;
    name_49.content.ptr = "float32Field";
    DynamicStruct::Builder::get((Builder *)&_kjCondition_31,&subReader,name_49);
    fVar12 = DynamicValue::Builder::AsImpl<float,_(capnp::Kind)0>::apply
                       ((Builder *)&_kjCondition_31);
    _kjCondition.left = (Void *)CONCAT44(_kjCondition.left._4_4_,fVar12);
    _kjCondition_29.left._0_4_ = 0xaf09705f;
    kj::_::Debug::log<char_const(&)[107],kj::_::DebugExpression<bool>&,float,float>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x172,ERROR,
               "\"failed: expected \" \"::kj::_::floatAlmostEqual(subReader.get(\\\"float32Field\\\").template as<float>(), -1.25e-10f)\", _kjCondition, subReader.get(\"float32Field\").template as<float>(), -1.25e-10f"
               ,(char (*) [107])
                "failed: expected ::kj::_::floatAlmostEqual(subReader.get(\"float32Field\").template as<float>(), -1.25e-10f)"
               ,&_kjCondition_10,(float *)&_kjCondition,(float *)&_kjCondition_29);
    DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
  }
  name_50.content.size_ = 0xd;
  name_50.content.ptr = "float64Field";
  DynamicStruct::Builder::get((Builder *)&_kjCondition_31,&subReader,name_50);
  dVar1 = DynamicValue::Builder::AsImpl<double,_(capnp::Kind)0>::apply((Builder *)&_kjCondition_31);
  bVar5 = kj::_::doubleAlmostEqual(dVar1,345.0);
  _kjCondition_10.value = bVar5;
  DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
  if ((_kjCondition_10.value == false) && (kj::_::Debug::minSeverity < 3)) {
    name_51.content.size_ = 0xd;
    name_51.content.ptr = "float64Field";
    DynamicStruct::Builder::get((Builder *)&_kjCondition_31,&subReader,name_51);
    _kjCondition.left =
         (Void *)DynamicValue::Builder::AsImpl<double,_(capnp::Kind)0>::apply
                           ((Builder *)&_kjCondition_31);
    _kjCondition_29.left._0_4_ = 0x159;
    kj::_::Debug::log<char_const(&)[102],kj::_::DebugExpression<bool>&,double,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x173,ERROR,
               "\"failed: expected \" \"::kj::_::doubleAlmostEqual(subReader.get(\\\"float64Field\\\").template as<double>(), 345)\", _kjCondition, subReader.get(\"float64Field\").template as<double>(), 345"
               ,(char (*) [102])
                "failed: expected ::kj::_::doubleAlmostEqual(subReader.get(\"float64Field\").template as<double>(), 345)"
               ,&_kjCondition_10,(double *)&_kjCondition,(int *)&_kjCondition_29);
    DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
  }
  __kjCondition_10 = "baz";
  name_52.content.size_ = 10;
  name_52.content.ptr = "textField";
  DynamicStruct::Builder::get((Builder *)&_kjCondition_31,&subReader,name_52);
  DynamicValue::Builder::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
            ((BuilderFor<Text> *)&_kjCondition_29,(Builder *)&_kjCondition_31);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_capnp::Text::Builder> *)&_kjCondition,
             (DebugExpression<char_const(&)[4]> *)&_kjCondition_10,(Builder *)&_kjCondition_29);
  DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
  if (((bool)local_7f0 == false) && (kj::_::Debug::minSeverity < 3)) {
    name_53.content.size_ = 10;
    name_53.content.ptr = "textField";
    DynamicStruct::Builder::get((Builder *)&_kjCondition_31,&subReader,name_53);
    DynamicValue::Builder::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
              ((BuilderFor<Text> *)&_kjCondition_29,(Builder *)&_kjCondition_31);
    kj::_::Debug::
    log<char_const(&)[77],kj::_::DebugComparison<char_const(&)[4],capnp::Text::Builder>&,char_const(&)[4],capnp::Text::Builder>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x174,ERROR,
               "\"failed: expected \" \"(\\\"baz\\\") == (subReader.get(\\\"textField\\\").template as<Text>())\", _kjCondition, \"baz\", subReader.get(\"textField\").template as<Text>()"
               ,(char (*) [77])
                "failed: expected (\"baz\") == (subReader.get(\"textField\").template as<Text>())",
               (DebugComparison<const_char_(&)[4],_capnp::Text::Builder> *)&_kjCondition,
               (char (*) [4])0x2642a2,(Builder *)&_kjCondition_29);
    DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
  }
  _kjCondition_29._0_16_ = _::data("qux");
  name_54.content.size_ = 10;
  name_54.content.ptr = "dataField";
  DynamicStruct::Builder::get((Builder *)&_kjCondition_31,&subReader,name_54);
  __kjCondition_10 =
       (ArrayPtr<unsigned_char>)
       DynamicValue::Builder::AsImpl<capnp::Data,_(capnp::Kind)1>::apply
                 ((Builder *)&_kjCondition_31);
  kj::_::DebugExpression<capnp::Data::Reader>::operator==
            ((DebugComparison<capnp::Data::Reader,_capnp::Data::Builder> *)&_kjCondition,
             (DebugExpression<capnp::Data::Reader> *)&_kjCondition_29,(Builder *)&_kjCondition_10);
  DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
  if (((bool)local_7f0 == false) && (kj::_::Debug::minSeverity < 3)) {
    _kjCondition_29._0_16_ = _::data("qux");
    name_55.content.size_ = 10;
    name_55.content.ptr = "dataField";
    DynamicStruct::Builder::get((Builder *)&_kjCondition_31,&subReader,name_55);
    __kjCondition_10 =
         (ArrayPtr<unsigned_char>)
         DynamicValue::Builder::AsImpl<capnp::Data,_(capnp::Kind)1>::apply
                   ((Builder *)&_kjCondition_31);
    kj::_::Debug::
    log<char_const(&)[83],kj::_::DebugComparison<capnp::Data::Reader,capnp::Data::Builder>&,capnp::Data::Reader,capnp::Data::Builder>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x175,ERROR,
               "\"failed: expected \" \"(data(\\\"qux\\\")) == (subReader.get(\\\"dataField\\\").template as<Data>())\", _kjCondition, data(\"qux\"), subReader.get(\"dataField\").template as<Data>()"
               ,(char (*) [83])
                "failed: expected (data(\"qux\")) == (subReader.get(\"dataField\").template as<Data>())"
               ,(DebugComparison<capnp::Data::Reader,_capnp::Data::Builder> *)&_kjCondition,
               (Reader *)&_kjCondition_29,(Builder *)&_kjCondition_10);
    DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
  }
  name_56.content.size_ = 0xc;
  name_56.content.ptr = "structField";
  DynamicStruct::Builder::get((Builder *)&_kjCondition_31,&subReader,name_56);
  DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicStruct> *)&_kjCondition_10,(Builder *)&_kjCondition_31);
  DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
  local_720.schema.super_Schema.raw = (Schema)((long)"really nested" + 7);
  name_57.content.size_ = 10;
  name_57.content.ptr = "textField";
  DynamicStruct::Builder::get((Builder *)&_kjCondition_31,(Builder *)&_kjCondition_10,name_57);
  DynamicValue::Builder::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
            ((BuilderFor<Text> *)&_kjCondition_29,(Builder *)&_kjCondition_31);
  kj::_::DebugExpression<char_const(&)[7]>::operator==
            ((DebugComparison<const_char_(&)[7],_capnp::Text::Builder> *)&_kjCondition,
             (DebugExpression<char_const(&)[7]> *)&local_720,(Builder *)&_kjCondition_29);
  DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
  if (((bool)local_7f0 == false) && (kj::_::Debug::minSeverity < 3)) {
    name_58.content.size_ = 10;
    name_58.content.ptr = "textField";
    DynamicStruct::Builder::get((Builder *)&_kjCondition_31,(Builder *)&_kjCondition_10,name_58);
    DynamicValue::Builder::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
              ((BuilderFor<Text> *)&_kjCondition_29,(Builder *)&_kjCondition_31);
    kj::_::Debug::
    log<char_const(&)[83],kj::_::DebugComparison<char_const(&)[7],capnp::Text::Builder>&,char_const(&)[7],capnp::Text::Builder>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x178,ERROR,
               "\"failed: expected \" \"(\\\"nested\\\") == (subSubReader.get(\\\"textField\\\").template as<Text>())\", _kjCondition, \"nested\", subSubReader.get(\"textField\").template as<Text>()"
               ,(char (*) [83])
                "failed: expected (\"nested\") == (subSubReader.get(\"textField\").template as<Text>())"
               ,(DebugComparison<const_char_(&)[7],_capnp::Text::Builder> *)&_kjCondition,
               (char (*) [7])0x27317e,(Builder *)&_kjCondition_29);
    DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
  }
  local_740 = "really nested";
  name_59.content.size_ = 0xc;
  name_59.content.ptr = "structField";
  DynamicStruct::Builder::get((Builder *)&_kjCondition,(Builder *)&_kjCondition_10,name_59);
  DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            (&local_720,(Builder *)&_kjCondition);
  name_60.content.size_ = 10;
  name_60.content.ptr = "textField";
  DynamicStruct::Builder::get((Builder *)&_kjCondition_31,&local_720,name_60);
  DynamicValue::Builder::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
            (&local_738,(Builder *)&_kjCondition_31);
  kj::_::DebugExpression<char_const(&)[14]>::operator==
            (&_kjCondition_29,(DebugExpression<char_const(&)[14]> *)&local_740,&local_738);
  DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
  DynamicValue::Builder::~Builder((Builder *)&_kjCondition);
  if ((_kjCondition_29.result == false) && (kj::_::Debug::minSeverity < 3)) {
    name_61.content.size_ = 0xc;
    name_61.content.ptr = "structField";
    DynamicStruct::Builder::get((Builder *)&_kjCondition,(Builder *)&_kjCondition_10,name_61);
    DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
              (&local_720,(Builder *)&_kjCondition);
    name_62.content.size_ = 10;
    name_62.content.ptr = "textField";
    DynamicStruct::Builder::get((Builder *)&_kjCondition_31,&local_720,name_62);
    DynamicValue::Builder::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
              (&local_738,(Builder *)&_kjCondition_31);
    kj::_::Debug::
    log<char_const(&)[139],kj::_::DebugComparison<char_const(&)[14],capnp::Text::Builder>&,char_const(&)[14],capnp::Text::Builder>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x17a,ERROR,
               "\"failed: expected \" \"(\\\"really nested\\\") == (subSubReader.get(\\\"structField\\\").template as<DynamicStruct>() .get(\\\"textField\\\").template as<Text>())\", _kjCondition, \"really nested\", subSubReader.get(\"structField\").template as<DynamicStruct>() .get(\"textField\").template as<Text>()"
               ,(char (*) [139])
                "failed: expected (\"really nested\") == (subSubReader.get(\"structField\").template as<DynamicStruct>() .get(\"textField\").template as<Text>())"
               ,&_kjCondition_29,(char (*) [14])"really nested",&local_738);
    DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
    DynamicValue::Builder::~Builder((Builder *)&_kjCondition);
  }
  __kjCondition_10 = "baz";
  name_63.content.size_ = 10;
  name_63.content.ptr = "enumField";
  DynamicStruct::Builder::get((Builder *)&_kjCondition_31,&subReader,name_63);
  BVar13 = DynamicValue::Builder::AsImpl<capnp::DynamicEnum,_(capnp::Kind)7>::apply
                     ((Builder *)&_kjCondition_31);
  e._8_8_ = BVar13._8_8_;
  e.schema.super_Schema.raw._4_4_ = 0;
  e.schema.super_Schema.raw._0_4_ = BVar13._8_4_;
  _kjCondition_29._0_16_ =
       anon_unknown_133::name((anon_unknown_133 *)BVar13.schema.super_Schema.raw.super_Schema,e);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_capnp::Text::Reader> *)&_kjCondition,
             (DebugExpression<char_const(&)[4]> *)&_kjCondition_10,(Reader *)&_kjCondition_29);
  DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
  if ((local_7f8 == '\0') && (kj::_::Debug::minSeverity < 3)) {
    name_64.content.size_ = 10;
    name_64.content.ptr = "enumField";
    DynamicStruct::Builder::get((Builder *)&_kjCondition_31,&subReader,name_64);
    BVar13 = DynamicValue::Builder::AsImpl<capnp::DynamicEnum,_(capnp::Kind)7>::apply
                       ((Builder *)&_kjCondition_31);
    e_00._8_8_ = BVar13._8_8_;
    e_00.schema.super_Schema.raw._4_4_ = 0;
    e_00.schema.super_Schema.raw._0_4_ = BVar13._8_4_;
    _kjCondition_29._0_16_ =
         anon_unknown_133::name
                   ((anon_unknown_133 *)BVar13.schema.super_Schema.raw.super_Schema,e_00);
    kj::_::Debug::
    log<char_const(&)[90],kj::_::DebugComparison<char_const(&)[4],capnp::Text::Reader>&,char_const(&)[4],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x17c,ERROR,
               "\"failed: expected \" \"(\\\"baz\\\") == (name(subReader.get(\\\"enumField\\\").template as<DynamicEnum>()))\", _kjCondition, \"baz\", name(subReader.get(\"enumField\").template as<DynamicEnum>())"
               ,(char (*) [90])
                "failed: expected (\"baz\") == (name(subReader.get(\"enumField\").template as<DynamicEnum>()))"
               ,(DebugComparison<const_char_(&)[4],_capnp::Text::Reader> *)&_kjCondition,
               (char (*) [4])0x2642a2,(Reader *)&_kjCondition_29);
    DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
  }
  sVar11 = 9;
  name_65.content.size_ = 9;
  name_65.content.ptr = "voidList";
  DynamicStruct::Builder::get(&local_70,&subReader,name_65);
  expected._M_len = sVar11;
  expected._M_array = (iterator)0x3;
  checkList<capnp::Void,capnp::DynamicValue::Builder>
            ((_ *)&local_70,(Builder *)&_kjCondition_31,expected);
  DynamicValue::Builder::~Builder(&local_70);
  sVar11 = 9;
  name_66.content.size_ = 9;
  name_66.content.ptr = "boolList";
  DynamicStruct::Builder::get(&local_b0,&subReader,name_66);
  _kjCondition_31._0_5_ = 0x101000100;
  expected_00._M_len = sVar11;
  expected_00._M_array = (iterator)&DAT_00000005;
  checkList<bool,capnp::DynamicValue::Builder>
            ((_ *)&local_b0,(Builder *)&_kjCondition_31,expected_00);
  DynamicValue::Builder::~Builder(&local_b0);
  sVar11 = 9;
  name_67.content.size_ = 9;
  name_67.content.ptr = "int8List";
  DynamicStruct::Builder::get(&local_f0,&subReader,name_67);
  _kjCondition_31.left = 0x7f80de0c;
  expected_01._M_len = sVar11;
  expected_01._M_array = (iterator)0x4;
  checkList<signed_char,capnp::DynamicValue::Builder>
            ((_ *)&local_f0,(Builder *)&_kjCondition_31,expected_01);
  DynamicValue::Builder::~Builder(&local_f0);
  sVar11 = 10;
  name_68.content.size_ = 10;
  name_68.content.ptr = "int16List";
  DynamicStruct::Builder::get(&local_130,&subReader,name_68);
  _kjCondition_31.left = 0xe9d204d2;
  _kjCondition_31.right = 0x7fff8000;
  expected_02._M_len = sVar11;
  expected_02._M_array = (iterator)0x4;
  checkList<short,capnp::DynamicValue::Builder>
            ((_ *)&local_130,(Builder *)&_kjCondition_31,expected_02);
  DynamicValue::Builder::~Builder(&local_130);
  sVar11 = 10;
  name_69.content.size_ = 10;
  name_69.content.ptr = "int32List";
  DynamicStruct::Builder::get(&local_170,&subReader,name_69);
  _kjCondition_31.left = 0xbc614e;
  _kjCondition_31.right = 0xfaa0d340;
  _kjCondition_31.op.content.ptr = (char *)0x7fffffff80000000;
  expected_03._M_len = sVar11;
  expected_03._M_array = (iterator)0x4;
  checkList<int,capnp::DynamicValue::Builder>
            ((_ *)&local_170,(Builder *)&_kjCondition_31,expected_03);
  DynamicValue::Builder::~Builder(&local_170);
  sVar11 = 10;
  name_70.content.size_ = 10;
  name_70.content.ptr = "int64List";
  DynamicStruct::Builder::get(&local_1b0,&subReader,name_70);
  _kjCondition_31.op.content.size_ = 0x8000000000000000;
  _kjCondition_31.result = true;
  _kjCondition_31._25_7_ = 0x7fffffffffffff;
  _kjCondition_31.op.content.ptr = (char *)0xfffd968afd13752e;
  _kjCondition_31.left = 0x860ddf79;
  _kjCondition_31.right = 0x7048;
  expected_04._M_len = sVar11;
  expected_04._M_array = (iterator)0x4;
  checkList<long,capnp::DynamicValue::Builder>
            ((_ *)&local_1b0,(Builder *)&_kjCondition_31,expected_04);
  DynamicValue::Builder::~Builder(&local_1b0);
  sVar11 = 10;
  name_71.content.size_ = 10;
  name_71.content.ptr = "uInt8List";
  DynamicStruct::Builder::get(&local_1f0,&subReader,name_71);
  _kjCondition_31.left = 0xff00220c;
  expected_05._M_len = sVar11;
  expected_05._M_array = (iterator)0x4;
  checkList<unsigned_char,capnp::DynamicValue::Builder>
            ((_ *)&local_1f0,(Builder *)&_kjCondition_31,expected_05);
  DynamicValue::Builder::~Builder(&local_1f0);
  sVar11 = 0xb;
  name_72.content.size_ = 0xb;
  name_72.content.ptr = "uInt16List";
  DynamicStruct::Builder::get(&local_230,&subReader,name_72);
  _kjCondition_31.left = 0x162e04d2;
  _kjCondition_31.right = 0xffff0000;
  expected_06._M_len = sVar11;
  expected_06._M_array = (iterator)0x4;
  checkList<unsigned_short,capnp::DynamicValue::Builder>
            ((_ *)&local_230,(Builder *)&_kjCondition_31,expected_06);
  DynamicValue::Builder::~Builder(&local_230);
  sVar11 = 0xb;
  name_73.content.size_ = 0xb;
  name_73.content.ptr = "uInt32List";
  DynamicStruct::Builder::get(&local_270,&subReader,name_73);
  _kjCondition_31.left = 0xbc614e;
  _kjCondition_31.right = 0x55f2cc0;
  _kjCondition_31.op.content.ptr = (char *)0xffffffff00000000;
  expected_07._M_len = sVar11;
  expected_07._M_array = (iterator)0x4;
  checkList<unsigned_int,capnp::DynamicValue::Builder>
            ((_ *)&local_270,(Builder *)&_kjCondition_31,expected_07);
  DynamicValue::Builder::~Builder(&local_270);
  sVar11 = 0xb;
  name_74.content.size_ = 0xb;
  name_74.content.ptr = "uInt64List";
  DynamicStruct::Builder::get(&local_2b0,&subReader,name_74);
  _kjCondition_31.op.content.size_ = 0;
  _kjCondition_31.result = true;
  _kjCondition_31._25_7_ = 0xffffffffffffff;
  _kjCondition_31.left = 0x860ddf79;
  _kjCondition_31.right = 0x7048;
  _kjCondition_31.op.content.ptr = (char *)0x2697502ec8ad2;
  expected_08._M_len = sVar11;
  expected_08._M_array = (iterator)0x4;
  checkList<unsigned_long,capnp::DynamicValue::Builder>
            ((_ *)&local_2b0,(Builder *)&_kjCondition_31,expected_08);
  DynamicValue::Builder::~Builder(&local_2b0);
  sVar11 = 0xc;
  name_75.content.size_ = 0xc;
  name_75.content.ptr = "float32List";
  DynamicStruct::Builder::get(&local_2f0,&subReader,name_75);
  _kjCondition_31.left = 0;
  _kjCondition_31.right = 0x4996b438;
  _kjCondition_31.op.content.ptr = (char *)0xfcf0bdc27cf0bdc2;
  _kjCondition_31.op.content.size_ = 0x82081cea02081cea;
  expected_09._M_len = sVar11;
  expected_09._M_array = (iterator)0x6;
  checkList<float,capnp::DynamicValue::Builder>
            ((_ *)&local_2f0,(Builder *)&_kjCondition_31,expected_09);
  DynamicValue::Builder::~Builder(&local_2f0);
  sVar11 = 0xc;
  name_76.content.size_ = 0xc;
  name_76.content.ptr = "float64List";
  DynamicStruct::Builder::get(&local_330,&subReader,name_76);
  _kjCondition_31.op.content.size_ = 0x7f76c8e5ca239029;
  _kjCondition_31.result = true;
  _kjCondition_31._25_7_ = 0xff76c8e5ca2390;
  _kjCondition_31.left = 0;
  _kjCondition_31.right = 0;
  _kjCondition_31.op.content.ptr = (char *)0x42dc12218377de40;
  expected_10._M_len = sVar11;
  expected_10._M_array = (iterator)0x6;
  checkList<double,capnp::DynamicValue::Builder>
            ((_ *)&local_330,(Builder *)&_kjCondition_31,expected_10);
  DynamicValue::Builder::~Builder(&local_330);
  sVar11 = 9;
  name_77.content.size_ = 9;
  name_77.content.ptr = "textList";
  DynamicStruct::Builder::get(&local_370,&subReader,name_77);
  _kjCondition_31.op.content.ptr = &DAT_00000005;
  _kjCondition_31._0_8_ = "quux";
  _kjCondition_31._24_8_ = 6;
  _kjCondition_31.op.content.size_ = (size_t)"corge";
  expected_11._M_len = sVar11;
  expected_11._M_array = (iterator)0x3;
  checkList<capnp::Text,capnp::DynamicValue::Builder>
            ((_ *)&local_370,(Builder *)&_kjCondition_31,expected_11);
  DynamicValue::Builder::~Builder(&local_370);
  sVar11 = 9;
  name_78.content.size_ = 9;
  name_78.content.ptr = "dataList";
  DynamicStruct::Builder::get(&local_6b0,&subReader,name_78);
  _kjCondition_31._0_16_ = _::data("garply");
  _kjCondition_31._16_16_ = _::data("waldo");
  _::data("fred");
  expected_12._M_len = sVar11;
  expected_12._M_array = (iterator)0x3;
  checkList<capnp::Data,capnp::DynamicValue::Builder>
            ((_ *)&local_6b0,(Builder *)&_kjCondition_31,expected_12);
  DynamicValue::Builder::~Builder(&local_6b0);
  name_79.content.size_ = 0xb;
  name_79.content.ptr = "structList";
  DynamicStruct::Builder::get((Builder *)&_kjCondition_31,&subReader,name_79);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicList> *)&_kjCondition_29,(Builder *)&_kjCondition_31);
  DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
  _kjCondition_31.right = (uint)_kjCondition_29.op.content.size_;
  _kjCondition_31.left = 3;
  _kjCondition_31.op.content.ptr = " == ";
  _kjCondition_31.result = (uint)_kjCondition_29.op.content.size_ == 3;
  _kjCondition_31.op.content.size_ = 5;
  if ((uint)_kjCondition_29.op.content.size_ == 3) {
    local_740 = "x structlist 1";
    DynamicList::Builder::operator[]((Builder *)&_kjCondition,(Builder *)&_kjCondition_29,0);
    DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
              (&local_720,(Builder *)&_kjCondition);
    name_80.content.size_ = 10;
    name_80.content.ptr = "textField";
    DynamicStruct::Builder::get((Builder *)&_kjCondition_31,&local_720,name_80);
    DynamicValue::Builder::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
              (&local_738,(Builder *)&_kjCondition_31);
    kj::_::DebugExpression<char_const(&)[15]>::operator==
              ((DebugComparison<const_char_(&)[15],_capnp::Text::Builder> *)&_kjCondition_10,
               (DebugExpression<char_const(&)[15]> *)&local_740,&local_738);
    DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
    DynamicValue::Builder::~Builder((Builder *)&_kjCondition);
    if ((local_748 == false) && (kj::_::Debug::minSeverity < 3)) {
      DynamicList::Builder::operator[]((Builder *)&_kjCondition,(Builder *)&_kjCondition_29,0);
      DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
                (&local_720,(Builder *)&_kjCondition);
      name_81.content.size_ = 10;
      name_81.content.ptr = "textField";
      DynamicStruct::Builder::get((Builder *)&_kjCondition_31,&local_720,name_81);
      DynamicValue::Builder::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
                (&local_738,(Builder *)&_kjCondition_31);
      kj::_::Debug::
      log<char_const(&)[121],kj::_::DebugComparison<char_const(&)[15],capnp::Text::Builder>&,char_const(&)[15],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,400,ERROR,
                 "\"failed: expected \" \"(\\\"x structlist 1\\\") == (listReader[0].template as<DynamicStruct>().get(\\\"textField\\\").template as<Text>())\", _kjCondition, \"x structlist 1\", listReader[0].template as<DynamicStruct>().get(\"textField\").template as<Text>()"
                 ,(char (*) [121])
                  "failed: expected (\"x structlist 1\") == (listReader[0].template as<DynamicStruct>().get(\"textField\").template as<Text>())"
                 ,(DebugComparison<const_char_(&)[15],_capnp::Text::Builder> *)&_kjCondition_10,
                 (char (*) [15])"x structlist 1",&local_738);
      DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
      DynamicValue::Builder::~Builder((Builder *)&_kjCondition);
    }
    local_740 = "x structlist 2";
    DynamicList::Builder::operator[]((Builder *)&_kjCondition,(Builder *)&_kjCondition_29,1);
    DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
              (&local_720,(Builder *)&_kjCondition);
    name_82.content.size_ = 10;
    name_82.content.ptr = "textField";
    DynamicStruct::Builder::get((Builder *)&_kjCondition_31,&local_720,name_82);
    DynamicValue::Builder::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
              (&local_738,(Builder *)&_kjCondition_31);
    kj::_::DebugExpression<char_const(&)[15]>::operator==
              ((DebugComparison<const_char_(&)[15],_capnp::Text::Builder> *)&_kjCondition_10,
               (DebugExpression<char_const(&)[15]> *)&local_740,&local_738);
    DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
    DynamicValue::Builder::~Builder((Builder *)&_kjCondition);
    if ((local_748 == false) && (kj::_::Debug::minSeverity < 3)) {
      DynamicList::Builder::operator[]((Builder *)&_kjCondition,(Builder *)&_kjCondition_29,1);
      DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
                (&local_720,(Builder *)&_kjCondition);
      name_83.content.size_ = 10;
      name_83.content.ptr = "textField";
      DynamicStruct::Builder::get((Builder *)&_kjCondition_31,&local_720,name_83);
      DynamicValue::Builder::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
                (&local_738,(Builder *)&_kjCondition_31);
      kj::_::Debug::
      log<char_const(&)[121],kj::_::DebugComparison<char_const(&)[15],capnp::Text::Builder>&,char_const(&)[15],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x191,ERROR,
                 "\"failed: expected \" \"(\\\"x structlist 2\\\") == (listReader[1].template as<DynamicStruct>().get(\\\"textField\\\").template as<Text>())\", _kjCondition, \"x structlist 2\", listReader[1].template as<DynamicStruct>().get(\"textField\").template as<Text>()"
                 ,(char (*) [121])
                  "failed: expected (\"x structlist 2\") == (listReader[1].template as<DynamicStruct>().get(\"textField\").template as<Text>())"
                 ,(DebugComparison<const_char_(&)[15],_capnp::Text::Builder> *)&_kjCondition_10,
                 (char (*) [15])"x structlist 2",&local_738);
      DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
      DynamicValue::Builder::~Builder((Builder *)&_kjCondition);
    }
    local_740 = "x structlist 3";
    DynamicList::Builder::operator[]((Builder *)&_kjCondition,(Builder *)&_kjCondition_29,2);
    DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
              (&local_720,(Builder *)&_kjCondition);
    name_84.content.size_ = 10;
    name_84.content.ptr = "textField";
    DynamicStruct::Builder::get((Builder *)&_kjCondition_31,&local_720,name_84);
    DynamicValue::Builder::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
              (&local_738,(Builder *)&_kjCondition_31);
    kj::_::DebugExpression<char_const(&)[15]>::operator==
              ((DebugComparison<const_char_(&)[15],_capnp::Text::Builder> *)&_kjCondition_10,
               (DebugExpression<char_const(&)[15]> *)&local_740,&local_738);
    DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
    DynamicValue::Builder::~Builder((Builder *)&_kjCondition);
    if ((local_748 == false) && (kj::_::Debug::minSeverity < 3)) {
      DynamicList::Builder::operator[]((Builder *)&_kjCondition,(Builder *)&_kjCondition_29,2);
      DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
                (&local_720,(Builder *)&_kjCondition);
      name_85.content.size_ = 10;
      name_85.content.ptr = "textField";
      DynamicStruct::Builder::get((Builder *)&_kjCondition_31,&local_720,name_85);
      DynamicValue::Builder::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
                (&local_738,(Builder *)&_kjCondition_31);
      kj::_::Debug::
      log<char_const(&)[121],kj::_::DebugComparison<char_const(&)[15],capnp::Text::Builder>&,char_const(&)[15],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x192,ERROR,
                 "\"failed: expected \" \"(\\\"x structlist 3\\\") == (listReader[2].template as<DynamicStruct>().get(\\\"textField\\\").template as<Text>())\", _kjCondition, \"x structlist 3\", listReader[2].template as<DynamicStruct>().get(\"textField\").template as<Text>()"
                 ,(char (*) [121])
                  "failed: expected (\"x structlist 3\") == (listReader[2].template as<DynamicStruct>().get(\"textField\").template as<Text>())"
                 ,(DebugComparison<const_char_(&)[15],_capnp::Text::Builder> *)&_kjCondition_10,
                 (char (*) [15])"x structlist 3",&local_738);
      DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
      DynamicValue::Builder::~Builder((Builder *)&_kjCondition);
    }
    sVar11 = 9;
    name_86.content.size_ = 9;
    name_86.content.ptr = "enumList";
    DynamicStruct::Builder::get(&local_3b0,&subReader,name_86);
    _kjCondition_31.op.content.size_ = (size_t)"grault";
    _kjCondition_31.op.content.ptr = "bar";
    _kjCondition_31._0_8_ = "qux";
    expected_13._M_len = sVar11;
    expected_13._M_array = (iterator)0x3;
    checkEnumList<capnp::DynamicValue::Builder>
              ((anon_unknown_133 *)&local_3b0,(Builder *)&_kjCondition_31,expected_13);
    DynamicValue::Builder::~Builder(&local_3b0);
    __kjCondition_10 = (uchar *)"corge";
    name_87.content.size_ = 10;
    name_87.content.ptr = "enumField";
    DynamicStruct::Builder::get((Builder *)&_kjCondition_31,&reader,name_87);
    BVar13 = DynamicValue::Builder::AsImpl<capnp::DynamicEnum,_(capnp::Kind)7>::apply
                       ((Builder *)&_kjCondition_31);
    e_01._8_8_ = BVar13._8_8_;
    e_01.schema.super_Schema.raw._4_4_ = 0;
    e_01.schema.super_Schema.raw._0_4_ = BVar13._8_4_;
    _kjCondition_29._0_16_ =
         anon_unknown_133::name
                   ((anon_unknown_133 *)BVar13.schema.super_Schema.raw.super_Schema,e_01);
    kj::_::DebugExpression<char_const(&)[6]>::operator==
              ((DebugComparison<const_char_(&)[6],_capnp::Text::Reader> *)&_kjCondition,
               (DebugExpression<char_const(&)[6]> *)&_kjCondition_10,(Reader *)&_kjCondition_29);
    DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
    if ((local_7f8 == '\0') && (kj::_::Debug::minSeverity < 3)) {
      name_88.content.size_ = 10;
      name_88.content.ptr = "enumField";
      DynamicStruct::Builder::get((Builder *)&_kjCondition_31,&reader,name_88);
      BVar13 = DynamicValue::Builder::AsImpl<capnp::DynamicEnum,_(capnp::Kind)7>::apply
                         ((Builder *)&_kjCondition_31);
      e_02._8_8_ = BVar13._8_8_;
      e_02.schema.super_Schema.raw._4_4_ = 0;
      e_02.schema.super_Schema.raw._0_4_ = BVar13._8_4_;
      _kjCondition_29._0_16_ =
           anon_unknown_133::name
                     ((anon_unknown_133 *)BVar13.schema.super_Schema.raw.super_Schema,e_02);
      kj::_::Debug::
      log<char_const(&)[89],kj::_::DebugComparison<char_const(&)[6],capnp::Text::Reader>&,char_const(&)[6],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x196,ERROR,
                 "\"failed: expected \" \"(\\\"corge\\\") == (name(reader.get(\\\"enumField\\\").template as<DynamicEnum>()))\", _kjCondition, \"corge\", name(reader.get(\"enumField\").template as<DynamicEnum>())"
                 ,(char (*) [89])
                  "failed: expected (\"corge\") == (name(reader.get(\"enumField\").template as<DynamicEnum>()))"
                 ,(DebugComparison<const_char_(&)[6],_capnp::Text::Reader> *)&_kjCondition,
                 (char (*) [6])"corge",(Reader *)&_kjCondition_29);
      DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
    }
    name_89.content.size_ = 9;
    name_89.content.ptr = "voidList";
    DynamicStruct::Builder::get((Builder *)&_kjCondition_31,&reader,name_89);
    DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((BuilderFor<DynamicList> *)&_kjCondition,(Builder *)&_kjCondition_31);
    _kjCondition_29.left._4_4_ = _local_7f8;
    _kjCondition_29.left._0_4_ = 6;
    _kjCondition_29.right._0_8_ = " == ";
    _kjCondition_29.right.content.ptr = &DAT_00000005;
    _kjCondition_29.right.content.size_ =
         CONCAT71(_kjCondition_29.right.content.size_._1_7_,_local_7f8 == 6);
    DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
    if (((char)_kjCondition_29.right.content.size_ == '\0') && (kj::_::Debug::minSeverity < 3)) {
      __kjCondition_10 = 6;
      name_90.content.size_ = 9;
      name_90.content.ptr = "voidList";
      DynamicStruct::Builder::get((Builder *)&_kjCondition_31,&reader,name_90);
      DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
                ((BuilderFor<DynamicList> *)&_kjCondition,(Builder *)&_kjCondition_31);
      subReader.schema.super_Schema.raw._0_4_ = _local_7f8;
      kj::_::Debug::
      log<char_const(&)[84],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x198,ERROR,
                 "\"failed: expected \" \"(6u) == (reader.get(\\\"voidList\\\").template as<DynamicList>().size())\", _kjCondition, 6u, reader.get(\"voidList\").template as<DynamicList>().size()"
                 ,(char (*) [84])
                  "failed: expected (6u) == (reader.get(\"voidList\").template as<DynamicList>().size())"
                 ,(DebugComparison<unsigned_int,_unsigned_int> *)&_kjCondition_29,
                 (uint *)&_kjCondition_10,(uint *)&subReader);
      DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
    }
    sVar11 = 9;
    name_91.content.size_ = 9;
    name_91.content.ptr = "boolList";
    DynamicStruct::Builder::get(&local_3f0,&reader,name_91);
    _kjCondition_31.left = 0x1000001;
    expected_14._M_len = sVar11;
    expected_14._M_array = (iterator)0x4;
    checkList<bool,capnp::DynamicValue::Builder>
              ((_ *)&local_3f0,(Builder *)&_kjCondition_31,expected_14);
    DynamicValue::Builder::~Builder(&local_3f0);
    sVar11 = 9;
    name_92.content.size_ = 9;
    name_92.content.ptr = "int8List";
    DynamicStruct::Builder::get(&local_430,&reader,name_92);
    _kjCondition_31.left._0_2_ = 0x916f;
    expected_15._M_len = sVar11;
    expected_15._M_array = (iterator)0x2;
    checkList<signed_char,capnp::DynamicValue::Builder>
              ((_ *)&local_430,(Builder *)&_kjCondition_31,expected_15);
    DynamicValue::Builder::~Builder(&local_430);
    sVar11 = 10;
    name_93.content.size_ = 10;
    name_93.content.ptr = "int16List";
    DynamicStruct::Builder::get(&local_470,&reader,name_93);
    _kjCondition_31.left = 0xd4992b67;
    expected_16._M_len = sVar11;
    expected_16._M_array = (iterator)0x2;
    checkList<short,capnp::DynamicValue::Builder>
              ((_ *)&local_470,(Builder *)&_kjCondition_31,expected_16);
    DynamicValue::Builder::~Builder(&local_470);
    sVar11 = 10;
    name_94.content.size_ = 10;
    name_94.content.ptr = "int32List";
    DynamicStruct::Builder::get(&local_4b0,&reader,name_94);
    _kjCondition_31.left = 0x69f6bc7;
    _kjCondition_31.right = 0xf9609439;
    expected_17._M_len = sVar11;
    expected_17._M_array = (iterator)0x2;
    checkList<int,capnp::DynamicValue::Builder>
              ((_ *)&local_4b0,(Builder *)&_kjCondition_31,expected_17);
    DynamicValue::Builder::~Builder(&local_4b0);
    sVar11 = 10;
    name_95.content.size_ = 10;
    name_95.content.ptr = "int64List";
    DynamicStruct::Builder::get(&local_4f0,&reader,name_95);
    _kjCondition_31.op.content.ptr = (char *)0xf0948a54d43b8e39;
    _kjCondition_31.left = 0x2bc471c7;
    _kjCondition_31.right = 0xf6b75ab;
    expected_18._M_len = sVar11;
    expected_18._M_array = (iterator)0x2;
    checkList<long,capnp::DynamicValue::Builder>
              ((_ *)&local_4f0,(Builder *)&_kjCondition_31,expected_18);
    DynamicValue::Builder::~Builder(&local_4f0);
    sVar11 = 10;
    name_96.content.size_ = 10;
    name_96.content.ptr = "uInt8List";
    DynamicStruct::Builder::get(&local_530,&reader,name_96);
    _kjCondition_31.left._0_2_ = 0xde6f;
    expected_19._M_len = sVar11;
    expected_19._M_array = (iterator)0x2;
    checkList<unsigned_char,capnp::DynamicValue::Builder>
              ((_ *)&local_530,(Builder *)&_kjCondition_31,expected_19);
    DynamicValue::Builder::~Builder(&local_530);
    sVar11 = 0xb;
    name_97.content.size_ = 0xb;
    name_97.content.ptr = "uInt16List";
    DynamicStruct::Builder::get(&local_570,&reader,name_97);
    _kjCondition_31.left = 0xad9c8235;
    expected_20._M_len = sVar11;
    expected_20._M_array = (iterator)0x2;
    checkList<unsigned_short,capnp::DynamicValue::Builder>
              ((_ *)&local_570,(Builder *)&_kjCondition_31,expected_20);
    DynamicValue::Builder::~Builder(&local_570);
    sVar11 = 0xb;
    name_98.content.size_ = 0xb;
    name_98.content.ptr = "uInt32List";
    DynamicStruct::Builder::get(&local_5b0,&reader,name_98);
    _kjCondition_31.left = 0xc6aea155;
    expected_21._M_len = sVar11;
    expected_21._M_array = (iterator)0x1;
    checkList<unsigned_int,capnp::DynamicValue::Builder>
              ((_ *)&local_5b0,(Builder *)&_kjCondition_31,expected_21);
    DynamicValue::Builder::~Builder(&local_5b0);
    sVar11 = 0xb;
    name_99.content.size_ = 0xb;
    name_99.content.ptr = "uInt64List";
    DynamicStruct::Builder::get(&local_5f0,&reader,name_99);
    _kjCondition_31.left = 0xb5ac71c7;
    _kjCondition_31.right = 0x9a3298af;
    expected_22._M_len = sVar11;
    expected_22._M_array = (iterator)0x1;
    checkList<unsigned_long,capnp::DynamicValue::Builder>
              ((_ *)&local_5f0,(Builder *)&_kjCondition_31,expected_22);
    DynamicValue::Builder::~Builder(&local_5f0);
    name_x00100.content.size_ = 0xc;
    name_x00100.content.ptr = "float32List";
    DynamicStruct::Builder::get((Builder *)&_kjCondition_31,&reader,name_x00100);
    DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((BuilderFor<DynamicList> *)&_kjCondition,(Builder *)&_kjCondition_31);
    DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
    _kjCondition_31.right = _local_7f8;
    _kjCondition_31.left = 4;
    _kjCondition_31.op.content.ptr = " == ";
    _kjCondition_31.result = _local_7f8 == 4;
    _kjCondition_31.op.content.size_ = 5;
    if (_local_7f8 == 4) {
      DynamicList::Builder::operator[]((Builder *)&_kjCondition_31,(Builder *)&_kjCondition,0);
      _kjCondition_29.left._4_4_ =
           DynamicValue::Builder::AsImpl<float,_(capnp::Kind)0>::apply((Builder *)&_kjCondition_31);
      _kjCondition_29.left._0_4_ = 0x45ad9c00;
      _kjCondition_29.right._0_8_ = " == ";
      _kjCondition_29.right.content.ptr = &DAT_00000005;
      _kjCondition_29.right.content.size_ =
           CONCAT71(_kjCondition_29.right.content.size_._1_7_,_kjCondition_29.left._4_4_ == 5555.5);
      DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
      if (((char)_kjCondition_29.right.content.size_ == '\0') && (kj::_::Debug::minSeverity < 3)) {
        __kjCondition_10 = 0x45ad9c00;
        DynamicList::Builder::operator[]((Builder *)&_kjCondition_31,(Builder *)&_kjCondition,0);
        fVar12 = DynamicValue::Builder::AsImpl<float,_(capnp::Kind)0>::apply
                           ((Builder *)&_kjCondition_31);
        subReader.schema.super_Schema.raw._0_4_ = fVar12;
        kj::_::Debug::log<char_const(&)[67],kj::_::DebugComparison<float,float>&,float,float>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                   ,0x1a5,ERROR,
                   "\"failed: expected \" \"(5555.5f) == (listReader[0].template as<float>())\", _kjCondition, 5555.5f, listReader[0].template as<float>()"
                   ,(char (*) [67])
                    "failed: expected (5555.5f) == (listReader[0].template as<float>())",
                   (DebugComparison<float,_float> *)&_kjCondition_29,(float *)&_kjCondition_10,
                   (float *)&subReader);
        DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
      }
      DynamicList::Builder::operator[]((Builder *)&_kjCondition_31,(Builder *)&_kjCondition,1);
      _kjCondition_29.left._4_4_ =
           DynamicValue::Builder::AsImpl<float,_(capnp::Kind)0>::apply((Builder *)&_kjCondition_31);
      _kjCondition_29.left._0_4_ = 0x7f800000;
      _kjCondition_29.right._0_8_ = " == ";
      _kjCondition_29.right.content.ptr = &DAT_00000005;
      _kjCondition_29.right.content.size_ =
           CONCAT71(_kjCondition_29.right.content.size_._1_7_,INFINITY <= _kjCondition_29.left._4_4_
                   );
      DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
      if (((char)_kjCondition_29.right.content.size_ == '\0') && (kj::_::Debug::minSeverity < 3)) {
        __kjCondition_10 = 0x7f800000;
        DynamicList::Builder::operator[]((Builder *)&_kjCondition_31,(Builder *)&_kjCondition,1);
        fVar12 = DynamicValue::Builder::AsImpl<float,_(capnp::Kind)0>::apply
                           ((Builder *)&_kjCondition_31);
        subReader.schema.super_Schema.raw._0_4_ = fVar12;
        kj::_::Debug::log<char_const(&)[69],kj::_::DebugComparison<float,float>&,float,float>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                   ,0x1a6,ERROR,
                   "\"failed: expected \" \"(kj::inf()) == (listReader[1].template as<float>())\", _kjCondition, kj::inf(), listReader[1].template as<float>()"
                   ,(char (*) [69])
                    "failed: expected (kj::inf()) == (listReader[1].template as<float>())",
                   (DebugComparison<float,_float> *)&_kjCondition_29,(float *)&_kjCondition_10,
                   (float *)&subReader);
        DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
      }
      DynamicList::Builder::operator[]((Builder *)&_kjCondition_31,(Builder *)&_kjCondition,2);
      _kjCondition_29.left._4_4_ =
           DynamicValue::Builder::AsImpl<float,_(capnp::Kind)0>::apply((Builder *)&_kjCondition_31);
      _kjCondition_29.left._0_4_ = 0xff800000;
      _kjCondition_29.right._0_8_ = " == ";
      _kjCondition_29.right.content.ptr = &DAT_00000005;
      _kjCondition_29.right.content.size_ =
           CONCAT71(_kjCondition_29.right.content.size_._1_7_,
                    _kjCondition_29.left._4_4_ <= -INFINITY);
      DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
      if (((char)_kjCondition_29.right.content.size_ == '\0') && (kj::_::Debug::minSeverity < 3)) {
        __kjCondition_10 = 0xff800000;
        DynamicList::Builder::operator[]((Builder *)&_kjCondition_31,(Builder *)&_kjCondition,2);
        fVar12 = DynamicValue::Builder::AsImpl<float,_(capnp::Kind)0>::apply
                           ((Builder *)&_kjCondition_31);
        subReader.schema.super_Schema.raw._0_4_ = fVar12;
        kj::_::Debug::log<char_const(&)[70],kj::_::DebugComparison<float,float>&,float,float>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                   ,0x1a7,ERROR,
                   "\"failed: expected \" \"(-kj::inf()) == (listReader[2].template as<float>())\", _kjCondition, -kj::inf(), listReader[2].template as<float>()"
                   ,(char (*) [70])
                    "failed: expected (-kj::inf()) == (listReader[2].template as<float>())",
                   (DebugComparison<float,_float> *)&_kjCondition_29,(float *)&_kjCondition_10,
                   (float *)&subReader);
        DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
      }
      DynamicList::Builder::operator[]((Builder *)&_kjCondition_31,(Builder *)&_kjCondition,3);
      fVar12 = DynamicValue::Builder::AsImpl<float,_(capnp::Kind)0>::apply
                         ((Builder *)&_kjCondition_31);
      _kjCondition_29.left._0_1_ = NAN(fVar12);
      DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
      if (((char)_kjCondition_29.left == '\0') && (kj::_::Debug::minSeverity < 3)) {
        kj::_::Debug::log<char_const(&)[59],kj::_::DebugExpression<bool>&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                   ,0x1a8,ERROR,
                   "\"failed: expected \" \"isNaN(listReader[3].template as<float>())\", _kjCondition"
                   ,(char (*) [59])"failed: expected isNaN(listReader[3].template as<float>())",
                   (DebugExpression<bool> *)&_kjCondition_29);
      }
      name_x00101.content.size_ = 0xc;
      name_x00101.content.ptr = "float64List";
      DynamicStruct::Builder::get((Builder *)&_kjCondition_31,&reader,name_x00101);
      DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
                ((BuilderFor<DynamicList> *)&_kjCondition,(Builder *)&_kjCondition_31);
      DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
      _kjCondition_31.op.content.ptr = " == ";
      _kjCondition_31.left = 4;
      _kjCondition_31.right = 4;
      _kjCondition_31.result = true;
      _kjCondition_31.op.content.size_ = 5;
      DynamicList::Builder::operator[]((Builder *)&_kjCondition_31,(Builder *)&_kjCondition,0);
      _kjCondition_29.right._0_8_ =
           DynamicValue::Builder::AsImpl<double,_(capnp::Kind)0>::apply((Builder *)&_kjCondition_31)
      ;
      _kjCondition_29.op.content.ptr._0_1_ = (double)_kjCondition_29.right._0_8_ == 7777.75;
      _kjCondition_29.left = (char (*) [14])0x40be61c000000000;
      _kjCondition_29.right.content.ptr = " == ";
      _kjCondition_29.right.content.size_ = 5;
      DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
      if (((char)_kjCondition_29.op.content.ptr == '\0') && (kj::_::Debug::minSeverity < 3)) {
        __kjCondition_10 = (uchar *)0x40be61c000000000;
        DynamicList::Builder::operator[]((Builder *)&_kjCondition_31,(Builder *)&_kjCondition,0);
        subReader.schema.super_Schema.raw =
             (Schema)DynamicValue::Builder::AsImpl<double,_(capnp::Kind)0>::apply
                               ((Builder *)&_kjCondition_31);
        kj::_::Debug::log<char_const(&)[68],kj::_::DebugComparison<double,double>&,double,double>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                   ,0x1ad,ERROR,
                   "\"failed: expected \" \"(7777.75) == (listReader[0].template as<double>())\", _kjCondition, 7777.75, listReader[0].template as<double>()"
                   ,(char (*) [68])
                    "failed: expected (7777.75) == (listReader[0].template as<double>())",
                   (DebugComparison<double,_double> *)&_kjCondition_29,(double *)&_kjCondition_10,
                   (double *)&subReader);
        DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
      }
      DynamicList::Builder::operator[]((Builder *)&_kjCondition_31,(Builder *)&_kjCondition,1);
      dVar1 = DynamicValue::Builder::AsImpl<double,_(capnp::Kind)0>::apply
                        ((Builder *)&_kjCondition_31);
      _kjCondition_29.op.content.ptr._0_1_ = INFINITY <= dVar1;
      _kjCondition_29.left._0_4_ = 0x7f800000;
      _kjCondition_29.right._0_8_ = dVar1;
      _kjCondition_29.right.content.ptr = " == ";
      _kjCondition_29.right.content.size_ = 5;
      DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
      if (((char)_kjCondition_29.op.content.ptr == '\0') && (kj::_::Debug::minSeverity < 3)) {
        subReader.schema.super_Schema.raw._0_4_ = 0x7f800000;
        DynamicList::Builder::operator[]((Builder *)&_kjCondition_31,(Builder *)&_kjCondition,1);
        puVar10 = (uchar *)DynamicValue::Builder::AsImpl<double,_(capnp::Kind)0>::apply
                                     ((Builder *)&_kjCondition_31);
        __kjCondition_10 = puVar10;
        kj::_::Debug::log<char_const(&)[70],kj::_::DebugComparison<float,double>&,float,double>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                   ,0x1ae,ERROR,
                   "\"failed: expected \" \"(kj::inf()) == (listReader[1].template as<double>())\", _kjCondition, kj::inf(), listReader[1].template as<double>()"
                   ,(char (*) [70])
                    "failed: expected (kj::inf()) == (listReader[1].template as<double>())",
                   (DebugComparison<float,_double> *)&_kjCondition_29,(float *)&subReader,
                   (double *)&_kjCondition_10);
        DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
      }
      DynamicList::Builder::operator[]((Builder *)&_kjCondition_31,(Builder *)&_kjCondition,2);
      dVar1 = DynamicValue::Builder::AsImpl<double,_(capnp::Kind)0>::apply
                        ((Builder *)&_kjCondition_31);
      _kjCondition_29.op.content.ptr._0_1_ = dVar1 <= -INFINITY;
      _kjCondition_29.left._0_4_ = 0xff800000;
      _kjCondition_29.right._0_8_ = dVar1;
      _kjCondition_29.right.content.ptr = " == ";
      _kjCondition_29.right.content.size_ = 5;
      DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
      if (((char)_kjCondition_29.op.content.ptr == '\0') && (kj::_::Debug::minSeverity < 3)) {
        subReader.schema.super_Schema.raw._0_4_ = 0xff800000;
        DynamicList::Builder::operator[]((Builder *)&_kjCondition_31,(Builder *)&_kjCondition,2);
        puVar10 = (uchar *)DynamicValue::Builder::AsImpl<double,_(capnp::Kind)0>::apply
                                     ((Builder *)&_kjCondition_31);
        __kjCondition_10 = puVar10;
        kj::_::Debug::log<char_const(&)[71],kj::_::DebugComparison<float,double>&,float,double>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                   ,0x1af,ERROR,
                   "\"failed: expected \" \"(-kj::inf()) == (listReader[2].template as<double>())\", _kjCondition, -kj::inf(), listReader[2].template as<double>()"
                   ,(char (*) [71])
                    "failed: expected (-kj::inf()) == (listReader[2].template as<double>())",
                   (DebugComparison<float,_double> *)&_kjCondition_29,(float *)&subReader,
                   (double *)&_kjCondition_10);
        DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
      }
      DynamicList::Builder::operator[]((Builder *)&_kjCondition_31,(Builder *)&_kjCondition,3);
      dVar1 = DynamicValue::Builder::AsImpl<double,_(capnp::Kind)0>::apply
                        ((Builder *)&_kjCondition_31);
      _kjCondition_29.left._0_1_ = NAN(dVar1);
      DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
      if (((char)_kjCondition_29.left == '\0') && (kj::_::Debug::minSeverity < 3)) {
        kj::_::Debug::log<char_const(&)[60],kj::_::DebugExpression<bool>&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                   ,0x1b0,ERROR,
                   "\"failed: expected \" \"isNaN(listReader[3].template as<double>())\", _kjCondition"
                   ,(char (*) [60])"failed: expected isNaN(listReader[3].template as<double>())",
                   (DebugExpression<bool> *)&_kjCondition_29);
      }
      name_x00102.content.size_ = 9;
      name_x00102.content.ptr = "textList";
      DynamicStruct::Builder::get(&local_630,&reader,name_x00102);
      _kjCondition_31.op.content.ptr = (char *)0x6;
      _kjCondition_31._0_8_ = "plugh";
      _kjCondition_31._24_8_ = 6;
      _kjCondition_31.op.content.size_ = (size_t)"xyzzy";
      expected_23._M_len = 6;
      expected_23._M_array = (iterator)0x3;
      checkList<capnp::Text,capnp::DynamicValue::Builder>
                ((_ *)&local_630,(Builder *)&_kjCondition_31,expected_23);
      DynamicValue::Builder::~Builder(&local_630);
      sVar11 = 9;
      name_x00103.content.size_ = 9;
      name_x00103.content.ptr = "dataList";
      DynamicStruct::Builder::get(&local_6f0,&reader,name_x00103);
      _kjCondition_31._0_16_ = _::data("oops");
      _kjCondition_31._16_16_ = _::data("exhausted");
      _::data("rfc3092");
      expected_24._M_len = sVar11;
      expected_24._M_array = (iterator)0x3;
      checkList<capnp::Data,capnp::DynamicValue::Builder>
                ((_ *)&local_6f0,(Builder *)&_kjCondition_31,expected_24);
      DynamicValue::Builder::~Builder(&local_6f0);
      name_x00104.content.size_ = 0xb;
      name_x00104.content.ptr = "structList";
      DynamicStruct::Builder::get((Builder *)&_kjCondition_31,&reader,name_x00104);
      DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
                ((BuilderFor<DynamicList> *)&_kjCondition_29,(Builder *)&_kjCondition_31);
      DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
      _kjCondition_31.right = (uint)_kjCondition_29.op.content.size_;
      _kjCondition_31.left = 3;
      _kjCondition_31.op.content.ptr = " == ";
      _kjCondition_31.result = (uint)_kjCondition_29.op.content.size_ == 3;
      _kjCondition_31.op.content.size_ = 5;
      if ((uint)_kjCondition_29.op.content.size_ != 3) {
        __kjCondition_10 = 3;
        subReader.schema.super_Schema.raw._0_4_ = (uint)_kjCondition_29.op.content.size_;
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                  ((Fault *)&_kjCondition,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                   ,0x1b6,FAILED,"(3u) == (listReader.size())","_kjCondition,3u, listReader.size()",
                   &_kjCondition_31,(uint *)&_kjCondition_10,(uint *)&subReader);
        kj::_::Debug::Fault::fatal((Fault *)&_kjCondition);
      }
      local_738._0_8_ = "structlist 1";
      DynamicList::Builder::operator[]((Builder *)&_kjCondition,(Builder *)&_kjCondition_29,0);
      DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
                (&subReader,(Builder *)&_kjCondition);
      name_x00105.content.size_ = 10;
      name_x00105.content.ptr = "textField";
      DynamicStruct::Builder::get((Builder *)&_kjCondition_31,&subReader,name_x00105);
      DynamicValue::Builder::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
                ((BuilderFor<Text> *)&local_720,(Builder *)&_kjCondition_31);
      kj::_::DebugExpression<char_const(&)[13]>::operator==
                ((DebugComparison<const_char_(&)[13],_capnp::Text::Builder> *)&_kjCondition_10,
                 (DebugExpression<char_const(&)[13]> *)&local_738,(Builder *)&local_720);
      DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
      DynamicValue::Builder::~Builder((Builder *)&_kjCondition);
      if ((local_748 == false) && (kj::_::Debug::minSeverity < 3)) {
        DynamicList::Builder::operator[]((Builder *)&_kjCondition,(Builder *)&_kjCondition_29,0);
        DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
                  (&subReader,(Builder *)&_kjCondition);
        name_x00106.content.size_ = 10;
        name_x00106.content.ptr = "textField";
        DynamicStruct::Builder::get((Builder *)&_kjCondition_31,&subReader,name_x00106);
        DynamicValue::Builder::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
                  ((BuilderFor<Text> *)&local_720,(Builder *)&_kjCondition_31);
        kj::_::Debug::
        log<char_const(&)[119],kj::_::DebugComparison<char_const(&)[13],capnp::Text::Builder>&,char_const(&)[13],capnp::Text::Builder>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                   ,0x1b7,ERROR,
                   "\"failed: expected \" \"(\\\"structlist 1\\\") == (listReader[0].template as<DynamicStruct>().get(\\\"textField\\\").template as<Text>())\", _kjCondition, \"structlist 1\", listReader[0].template as<DynamicStruct>().get(\"textField\").template as<Text>()"
                   ,(char (*) [119])
                    "failed: expected (\"structlist 1\") == (listReader[0].template as<DynamicStruct>().get(\"textField\").template as<Text>())"
                   ,(DebugComparison<const_char_(&)[13],_capnp::Text::Builder> *)&_kjCondition_10,
                   (char (*) [13])0x273383,(Builder *)&local_720);
        DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
        DynamicValue::Builder::~Builder((Builder *)&_kjCondition);
      }
      local_738._0_8_ = "structlist 2";
      DynamicList::Builder::operator[]((Builder *)&_kjCondition,(Builder *)&_kjCondition_29,1);
      DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
                (&subReader,(Builder *)&_kjCondition);
      name_x00107.content.size_ = 10;
      name_x00107.content.ptr = "textField";
      DynamicStruct::Builder::get((Builder *)&_kjCondition_31,&subReader,name_x00107);
      DynamicValue::Builder::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
                ((BuilderFor<Text> *)&local_720,(Builder *)&_kjCondition_31);
      kj::_::DebugExpression<char_const(&)[13]>::operator==
                ((DebugComparison<const_char_(&)[13],_capnp::Text::Builder> *)&_kjCondition_10,
                 (DebugExpression<char_const(&)[13]> *)&local_738,(Builder *)&local_720);
      DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
      DynamicValue::Builder::~Builder((Builder *)&_kjCondition);
      if ((local_748 == false) && (kj::_::Debug::minSeverity < 3)) {
        DynamicList::Builder::operator[]((Builder *)&_kjCondition,(Builder *)&_kjCondition_29,1);
        DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
                  (&subReader,(Builder *)&_kjCondition);
        name_x00108.content.size_ = 10;
        name_x00108.content.ptr = "textField";
        DynamicStruct::Builder::get((Builder *)&_kjCondition_31,&subReader,name_x00108);
        DynamicValue::Builder::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
                  ((BuilderFor<Text> *)&local_720,(Builder *)&_kjCondition_31);
        kj::_::Debug::
        log<char_const(&)[119],kj::_::DebugComparison<char_const(&)[13],capnp::Text::Builder>&,char_const(&)[13],capnp::Text::Builder>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                   ,0x1b8,ERROR,
                   "\"failed: expected \" \"(\\\"structlist 2\\\") == (listReader[1].template as<DynamicStruct>().get(\\\"textField\\\").template as<Text>())\", _kjCondition, \"structlist 2\", listReader[1].template as<DynamicStruct>().get(\"textField\").template as<Text>()"
                   ,(char (*) [119])
                    "failed: expected (\"structlist 2\") == (listReader[1].template as<DynamicStruct>().get(\"textField\").template as<Text>())"
                   ,(DebugComparison<const_char_(&)[13],_capnp::Text::Builder> *)&_kjCondition_10,
                   (char (*) [13])0x263806,(Builder *)&local_720);
        DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
        DynamicValue::Builder::~Builder((Builder *)&_kjCondition);
      }
      local_738._0_8_ = "structlist 3";
      DynamicList::Builder::operator[]((Builder *)&_kjCondition,(Builder *)&_kjCondition_29,2);
      DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
                (&subReader,(Builder *)&_kjCondition);
      name_x00109.content.size_ = 10;
      name_x00109.content.ptr = "textField";
      DynamicStruct::Builder::get((Builder *)&_kjCondition_31,&subReader,name_x00109);
      DynamicValue::Builder::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
                ((BuilderFor<Text> *)&local_720,(Builder *)&_kjCondition_31);
      kj::_::DebugExpression<char_const(&)[13]>::operator==
                ((DebugComparison<const_char_(&)[13],_capnp::Text::Builder> *)&_kjCondition_10,
                 (DebugExpression<char_const(&)[13]> *)&local_738,(Builder *)&local_720);
      DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
      DynamicValue::Builder::~Builder((Builder *)&_kjCondition);
      if ((local_748 == false) && (kj::_::Debug::minSeverity < 3)) {
        DynamicList::Builder::operator[]((Builder *)&_kjCondition,(Builder *)&_kjCondition_29,2);
        DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
                  (&subReader,(Builder *)&_kjCondition);
        name_x00110.content.size_ = 10;
        name_x00110.content.ptr = "textField";
        DynamicStruct::Builder::get((Builder *)&_kjCondition_31,&subReader,name_x00110);
        DynamicValue::Builder::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
                  ((BuilderFor<Text> *)&local_720,(Builder *)&_kjCondition_31);
        kj::_::Debug::
        log<char_const(&)[119],kj::_::DebugComparison<char_const(&)[13],capnp::Text::Builder>&,char_const(&)[13],capnp::Text::Builder>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                   ,0x1b9,ERROR,
                   "\"failed: expected \" \"(\\\"structlist 3\\\") == (listReader[2].template as<DynamicStruct>().get(\\\"textField\\\").template as<Text>())\", _kjCondition, \"structlist 3\", listReader[2].template as<DynamicStruct>().get(\"textField\").template as<Text>()"
                   ,(char (*) [119])
                    "failed: expected (\"structlist 3\") == (listReader[2].template as<DynamicStruct>().get(\"textField\").template as<Text>())"
                   ,(DebugComparison<const_char_(&)[13],_capnp::Text::Builder> *)&_kjCondition_10,
                   (char (*) [13])0x273543,(Builder *)&local_720);
        DynamicValue::Builder::~Builder((Builder *)&_kjCondition_31);
        DynamicValue::Builder::~Builder((Builder *)&_kjCondition);
      }
      sVar11 = 9;
      name_x00111.content.size_ = 9;
      name_x00111.content.ptr = "enumList";
      DynamicStruct::Builder::get(&local_670,&reader,name_x00111);
      _kjCondition_31.op.content.ptr = "garply";
      _kjCondition_31._0_8_ = "foo";
      expected_25._M_len = sVar11;
      expected_25._M_array = (iterator)0x2;
      checkEnumList<capnp::DynamicValue::Builder>
                ((anon_unknown_133 *)&local_670,(Builder *)&_kjCondition_31,expected_25);
      DynamicValue::Builder::~Builder(&local_670);
      return;
    }
    __kjCondition_10 = 4;
    subReader.schema.super_Schema.raw._0_4_ = _local_7f8;
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ((Fault *)&_kjCondition_29,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1a4,FAILED,"(4u) == (listReader.size())","_kjCondition,4u, listReader.size()",
               &_kjCondition_31,(uint *)&_kjCondition_10,(uint *)&subReader);
    kj::_::Debug::Fault::fatal((Fault *)&_kjCondition_29);
  }
  __kjCondition_10 = 3;
  local_720.schema.super_Schema.raw._0_4_ = (uint)_kjCondition_29.op.content.size_;
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
            ((Fault *)&_kjCondition,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
             ,399,FAILED,"(3u) == (listReader.size())","_kjCondition,3u, listReader.size()",
             &_kjCondition_31,(uint *)&_kjCondition_10,(uint *)&local_720);
  kj::_::Debug::Fault::fatal((Fault *)&_kjCondition);
}

Assistant:

void dynamicCheckTestMessage(Reader reader) {
  EXPECT_EQ(VOID, reader.get("voidField").as<Void>());
  EXPECT_EQ(true, reader.get("boolField").as<bool>());
  EXPECT_EQ(-123, reader.get("int8Field").as<int8_t>());
  EXPECT_EQ(-12345, reader.get("int16Field").as<int16_t>());
  EXPECT_EQ(-12345678, reader.get("int32Field").as<int32_t>());
  EXPECT_EQ(-123456789012345ll, reader.get("int64Field").as<int64_t>());
  EXPECT_EQ(234u, reader.get("uInt8Field").as<uint8_t>());
  EXPECT_EQ(45678u, reader.get("uInt16Field").as<uint16_t>());
  EXPECT_EQ(3456789012u, reader.get("uInt32Field").as<uint32_t>());
  EXPECT_EQ(12345678901234567890ull, reader.get("uInt64Field").as<uint64_t>());
  EXPECT_FLOAT_EQ(1234.5f, reader.get("float32Field").as<float>());
  EXPECT_DOUBLE_EQ(-123e45, reader.get("float64Field").as<double>());
  EXPECT_EQ("foo", reader.get("textField").as<Text>());
  EXPECT_EQ(data("bar"), reader.get("dataField").as<Data>());
  {
    auto subReader = reader.get("structField").as<DynamicStruct>();
    EXPECT_EQ(VOID, subReader.get("voidField").as<Void>());
    EXPECT_EQ(true, subReader.get("boolField").as<bool>());
    EXPECT_EQ(-12, subReader.get("int8Field").as<int8_t>());
    EXPECT_EQ(3456, subReader.get("int16Field").as<int16_t>());
    EXPECT_EQ(-78901234, subReader.get("int32Field").as<int32_t>());
    EXPECT_EQ(56789012345678ll, subReader.get("int64Field").as<int64_t>());
    EXPECT_EQ(90u, subReader.get("uInt8Field").as<uint8_t>());
    EXPECT_EQ(1234u, subReader.get("uInt16Field").as<uint16_t>());
    EXPECT_EQ(56789012u, subReader.get("uInt32Field").as<uint32_t>());
    EXPECT_EQ(345678901234567890ull, subReader.get("uInt64Field").as<uint64_t>());
    EXPECT_FLOAT_EQ(-1.25e-10f, subReader.get("float32Field").as<float>());
    EXPECT_DOUBLE_EQ(345, subReader.get("float64Field").as<double>());
    EXPECT_EQ("baz", subReader.get("textField").as<Text>());
    EXPECT_EQ(data("qux"), subReader.get("dataField").as<Data>());
    {
      auto subSubReader = subReader.get("structField").as<DynamicStruct>();
      EXPECT_EQ("nested", subSubReader.get("textField").as<Text>());
      EXPECT_EQ("really nested", subSubReader.get("structField").as<DynamicStruct>()
                                             .get("textField").as<Text>());
    }
    EXPECT_EQ("baz", name(subReader.get("enumField").as<DynamicEnum>()));

    checkList<Void>(subReader.get("voidList"), {VOID, VOID, VOID});
    checkList<bool>(subReader.get("boolList"), {false, true, false, true, true});
    checkList<int8_t>(subReader.get("int8List"), {12, -34, -0x80, 0x7f});
    checkList<int16_t>(subReader.get("int16List"), {1234, -5678, -0x8000, 0x7fff});
    // gcc warns on -0x800... and the only work-around I could find was to do -0x7ff...-1.
    checkList<int32_t>(subReader.get("int32List"), {12345678, -90123456, -0x7fffffff-1, 0x7fffffff});
    checkList<int64_t>(subReader.get("int64List"), {123456789012345ll, -678901234567890ll, -0x7fffffffffffffffll-1, 0x7fffffffffffffffll});
    checkList<uint8_t>(subReader.get("uInt8List"), {12u, 34u, 0u, 0xffu});
    checkList<uint16_t>(subReader.get("uInt16List"), {1234u, 5678u, 0u, 0xffffu});
    checkList<uint32_t>(subReader.get("uInt32List"), {12345678u, 90123456u, 0u, 0xffffffffu});
    checkList<uint64_t>(subReader.get("uInt64List"), {123456789012345ull, 678901234567890ull, 0ull, 0xffffffffffffffffull});
    checkList<float>(subReader.get("float32List"), {0.0f, 1234567.0f, 1e37f, -1e37f, 1e-37f, -1e-37f});
    checkList<double>(subReader.get("float64List"), {0.0, 123456789012345.0, 1e306, -1e306, 1e-306, -1e-306});
    checkList<Text>(subReader.get("textList"), {"quux", "corge", "grault"});
    checkList<Data>(subReader.get("dataList"), {data("garply"), data("waldo"), data("fred")});
    {
      auto listReader = subReader.get("structList").as<DynamicList>();
      ASSERT_EQ(3u, listReader.size());
      EXPECT_EQ("x structlist 1", listReader[0].as<DynamicStruct>().get("textField").as<Text>());
      EXPECT_EQ("x structlist 2", listReader[1].as<DynamicStruct>().get("textField").as<Text>());
      EXPECT_EQ("x structlist 3", listReader[2].as<DynamicStruct>().get("textField").as<Text>());
    }
    checkEnumList(subReader.get("enumList"), {"qux", "bar", "grault"});
  }
  EXPECT_EQ("corge", name(reader.get("enumField").as<DynamicEnum>()));

  EXPECT_EQ(6u, reader.get("voidList").as<DynamicList>().size());
  checkList<bool>(reader.get("boolList"), {true, false, false, true});
  checkList<int8_t>(reader.get("int8List"), {111, -111});
  checkList<int16_t>(reader.get("int16List"), {11111, -11111});
  checkList<int32_t>(reader.get("int32List"), {111111111, -111111111});
  checkList<int64_t>(reader.get("int64List"), {1111111111111111111ll, -1111111111111111111ll});
  checkList<uint8_t>(reader.get("uInt8List"), {111u, 222u});
  checkList<uint16_t>(reader.get("uInt16List"), {33333u, 44444u});
  checkList<uint32_t>(reader.get("uInt32List"), {3333333333u});
  checkList<uint64_t>(reader.get("uInt64List"), {11111111111111111111ull});
  {
    auto listReader = reader.get("float32List").as<DynamicList>();
    ASSERT_EQ(4u, listReader.size());
    EXPECT_EQ(5555.5f, listReader[0].as<float>());
    EXPECT_EQ(kj::inf(), listReader[1].as<float>());
    EXPECT_EQ(-kj::inf(), listReader[2].as<float>());
    EXPECT_TRUE(isNaN(listReader[3].as<float>()));
  }
  {
    auto listReader = reader.get("float64List").as<DynamicList>();
    ASSERT_EQ(4u, listReader.size());
    EXPECT_EQ(7777.75, listReader[0].as<double>());
    EXPECT_EQ(kj::inf(), listReader[1].as<double>());
    EXPECT_EQ(-kj::inf(), listReader[2].as<double>());
    EXPECT_TRUE(isNaN(listReader[3].as<double>()));
  }
  checkList<Text>(reader.get("textList"), {"plugh", "xyzzy", "thud"});
  checkList<Data>(reader.get("dataList"), {data("oops"), data("exhausted"), data("rfc3092")});
  {
    auto listReader = reader.get("structList").as<DynamicList>();
    ASSERT_EQ(3u, listReader.size());
    EXPECT_EQ("structlist 1", listReader[0].as<DynamicStruct>().get("textField").as<Text>());
    EXPECT_EQ("structlist 2", listReader[1].as<DynamicStruct>().get("textField").as<Text>());
    EXPECT_EQ("structlist 3", listReader[2].as<DynamicStruct>().get("textField").as<Text>());
  }
  checkEnumList(reader.get("enumList"), {"foo", "garply"});
}